

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O2

void __thiscall Spaghetti<UFPC>::FirstScan(Spaghetti<UFPC> *this)

{
  long lVar1;
  char cVar2;
  Mat1b *pMVar3;
  long lVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  undefined4 uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar9 = *(uint *)&pMVar3->field_0x8;
  uVar25 = *(uint *)&pMVar3->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar9 & 0xfffffffe;
  this->o_rows = (uVar9 & 0x80000001) == 1;
  this->e_cols = uVar25 & 0xfffffffe;
  this->o_cols = (uVar25 & 0x80000001) == 1;
  puVar6 = UFPC::P_;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  lVar45 = *(long *)&pMVar3->field_0x10;
  if (uVar9 == 1) {
    lVar4 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    lVar44 = (long)(int)uVar25 + -2;
    uVar32 = 0xfffffffffffffffe;
LAB_0014a078:
    do {
      lVar30 = (long)(int)uVar32;
      uVar32 = lVar30 + 2;
      iVar35 = (int)lVar44;
      if (iVar35 <= (int)uVar32) {
        if (iVar35 < (int)uVar32) {
          if (*(char *)(lVar45 + uVar32) == '\0') {
            *(undefined4 *)(lVar4 + 8 + lVar30 * 4) = 0;
            return;
          }
        }
        else if (*(char *)(lVar45 + uVar32) == '\0') {
LAB_0014a490:
          if (*(char *)(lVar45 + 1 + uVar32) != '\0') {
            puVar6[UFPC::length_] = UFPC::length_;
            uVar9 = UFPC::length_ + 1;
            *(uint *)(lVar4 + uVar32 * 4) = UFPC::length_;
            UFPC::length_ = uVar9;
            return;
          }
          *(undefined4 *)(lVar4 + uVar32 * 4) = 0;
          return;
        }
        puVar6[UFPC::length_] = UFPC::length_;
        uVar9 = UFPC::length_ + 1;
        *(uint *)(lVar4 + 8 + lVar30 * 4) = UFPC::length_;
        UFPC::length_ = uVar9;
        return;
      }
      if (*(char *)(lVar45 + uVar32) == '\0') goto LAB_0014a0ac;
      cVar2 = *(char *)(lVar45 + 3 + lVar30);
      puVar6[UFPC::length_] = UFPC::length_;
      uVar9 = UFPC::length_ + 1;
      *(uint *)(lVar4 + 8 + lVar30 * 4) = UFPC::length_;
      UFPC::length_ = uVar9;
      uVar12 = uVar32;
    } while (cVar2 == '\0');
    do {
      uVar31 = uVar12 + 2;
      if (lVar44 <= (long)uVar31) {
        uVar32 = (ulong)(int)uVar31;
        if (iVar35 < (int)uVar31) {
          if (*(char *)(lVar45 + uVar32) == '\0') {
            *(undefined4 *)(lVar4 + uVar32 * 4) = 0;
            return;
          }
        }
        else if (*(char *)(lVar45 + uVar32) == '\0') goto LAB_0014a490;
        *(undefined4 *)(lVar4 + uVar32 * 4) = *(undefined4 *)(lVar4 + (long)(int)uVar12 * 4);
        return;
      }
      if (*(char *)(lVar45 + uVar31) == '\0') {
        uVar32 = uVar31 & 0xffffffff;
LAB_0014a0ac:
        uVar31 = (ulong)(int)uVar32;
        if (*(char *)(lVar45 + 1 + uVar31) == '\0') {
          uVar15 = 0;
          goto LAB_0014a0fb;
        }
        puVar6[UFPC::length_] = UFPC::length_;
        uVar12 = uVar31;
        uVar9 = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
      }
      else {
        if (*(char *)(lVar45 + 3 + uVar12) == '\0') goto LAB_0014a0f5;
        lVar30 = uVar12 * 4;
        uVar12 = uVar31;
        uVar9 = *(uint *)(lVar4 + lVar30);
      }
      *(uint *)(lVar4 + uVar12 * 4) = uVar9;
    } while( true );
  }
  uVar32 = 0xfffffffffffffffe;
  lVar44 = lVar45 + **(long **)&pMVar3->field_0x48;
  lVar28 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  lVar4 = (long)(int)uVar25 + -2;
  lVar30 = lVar45 + 2 + **(long **)&pMVar3->field_0x48;
  while( true ) {
    lVar36 = (long)(int)uVar32;
    uVar32 = lVar36 + 2;
    iVar35 = (int)lVar4;
    if (iVar35 <= (int)uVar32) break;
    if (*(char *)(lVar45 + uVar32) == '\0') {
      uVar12 = uVar32 & 0xffffffff;
      if (*(char *)(lVar44 + uVar32) == '\0') goto LAB_0014a17b;
    }
    else {
      uVar12 = uVar32 & 0xffffffff;
    }
LAB_0014a2e7:
    cVar2 = *(char *)(lVar45 + 1 + uVar32);
    puVar6[UFPC::length_] = UFPC::length_;
    uVar8 = UFPC::length_ + 1;
    *(uint *)(lVar28 + uVar32 * 4) = UFPC::length_;
    UFPC::length_ = uVar8;
    if (cVar2 != '\0') goto LAB_0014a1af;
LAB_0014a1e4:
    iVar40 = (int)uVar12;
    lVar27 = (long)iVar40;
    lVar36 = lVar28 + lVar27 * 4;
    lVar26 = lVar30 + lVar27;
    lVar43 = lVar27 << 0x20;
    lVar1 = lVar45 + 2 + lVar27;
    lVar38 = 0;
    while( true ) {
      lVar10 = lVar43 >> 0x20;
      if (lVar4 <= lVar38 + lVar27 + 2) {
        uVar12 = (ulong)(iVar40 + 2) + lVar38;
        uVar32 = lVar43 + 0x200000000 >> 0x20;
        if (iVar35 < (int)uVar12) {
          if ((*(char *)(lVar45 + uVar32) == '\0') && (*(char *)(lVar44 + uVar32) == '\0')) {
            *(undefined4 *)(lVar28 + uVar32 * 4) = 0;
            goto LAB_0014a557;
          }
        }
        else {
          if (*(char *)(lVar45 + uVar32) != '\0') {
            if (*(char *)(lVar44 + 1 + lVar10) != '\0') goto LAB_0014a54e;
            goto LAB_0014a3d3;
          }
          if (*(char *)(lVar44 + uVar32) == '\0') {
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_0014a4d6;
          }
        }
        lVar45 = lVar43 + 0x200000000 >> 0x1e;
        if (*(char *)(lVar44 + 1 + lVar10) == '\0') {
          puVar6[UFPC::length_] = UFPC::length_;
          uVar8 = UFPC::length_ + 1;
          *(uint *)(lVar28 + lVar45) = UFPC::length_;
          UFPC::length_ = uVar8;
        }
        else {
          *(undefined4 *)(lVar28 + lVar45) = *(undefined4 *)(lVar28 + lVar10 * 4);
        }
        goto LAB_0014a557;
      }
      if (*(char *)(lVar1 + lVar38) != '\0') {
        uVar12 = (ulong)(iVar40 + 2) + lVar38;
        if (*(char *)(lVar44 + 1 + lVar10) != '\0') {
          uVar32 = uVar12 & 0xffffffff;
          goto LAB_0014a1cd;
        }
        uVar32 = lVar43 + 0x200000000 >> 0x20;
        goto LAB_0014a2e7;
      }
      if (*(char *)(lVar26 + lVar38) == '\0') {
        uVar32 = (ulong)(iVar40 + (int)lVar38 + 2);
        goto LAB_0014a17b;
      }
      if (*(char *)(lVar1 + 1 + lVar38) != '\0') break;
      if (*(char *)(lVar26 + -1 + lVar38) == '\0') {
        puVar6[UFPC::length_] = UFPC::length_;
        uVar8 = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
      }
      else {
        uVar8 = *(uint *)(lVar36 + lVar38 * 4);
      }
      *(uint *)(lVar36 + 8 + lVar38 * 4) = uVar8;
      lVar38 = lVar38 + 2;
      lVar43 = lVar43 + 0x200000000;
    }
    lVar26 = lVar27 + 2 + lVar38;
    if (*(char *)(lVar30 + -1 + lVar27 + lVar38) == '\0') {
      uVar12 = (ulong)UFPC::length_;
      puVar6[uVar12] = UFPC::length_;
      UFPC::length_ = UFPC::length_ + 1;
    }
    else {
      uVar12 = (ulong)*(uint *)(lVar36 + lVar38 * 4);
    }
    uVar32 = (ulong)(iVar40 + 2) + lVar38 & 0xffffffff;
    while( true ) {
      *(int *)(lVar28 + lVar26 * 4) = (int)uVar12;
      uVar12 = uVar32 & 0xffffffff;
LAB_0014a1af:
      while( true ) {
        lVar36 = (long)(int)uVar12;
        uVar32 = lVar36 + 2;
        if (iVar35 <= (int)uVar32) {
          if ((int)uVar32 <= iVar35) {
            if ((*(char *)(lVar45 + uVar32) != '\0') || (*(char *)(lVar44 + uVar32) != '\0'))
            goto LAB_0014a54e;
            goto LAB_0014a4d6;
          }
          if ((*(char *)(lVar45 + uVar32) == '\0') && (*(char *)(lVar44 + uVar32) == '\0'))
          goto LAB_0014e001;
          *(undefined4 *)(lVar28 + 8 + lVar36 * 4) = *(undefined4 *)(lVar28 + lVar36 * 4);
          goto LAB_0014a557;
        }
        if ((*(char *)(lVar45 + uVar32) == '\0') && (*(char *)(lVar44 + uVar32) == '\0')) break;
LAB_0014a1cd:
        lVar36 = (long)(int)uVar32;
        cVar2 = *(char *)(lVar45 + 1 + lVar36);
        *(undefined4 *)(lVar28 + lVar36 * 4) = *(undefined4 *)(lVar28 + -8 + lVar36 * 4);
        uVar12 = uVar32 & 0xffffffff;
        if (cVar2 == '\0') goto LAB_0014a1e4;
      }
LAB_0014a17b:
      lVar26 = (long)(int)uVar32;
      if ((*(char *)(lVar26 + 1 + lVar45) == '\0') && (*(char *)(lVar44 + 1 + lVar26) == '\0'))
      break;
      uVar12 = (ulong)UFPC::length_;
      puVar6[uVar12] = UFPC::length_;
      UFPC::length_ = UFPC::length_ + 1;
    }
    *(undefined4 *)(lVar28 + (long)(int)uVar32 * 4) = 0;
  }
  if (iVar35 < (int)uVar32) {
    if ((*(char *)(lVar45 + uVar32) == '\0') && (*(char *)(lVar44 + uVar32) == '\0')) {
LAB_0014e001:
      *(undefined4 *)(lVar28 + 8 + lVar36 * 4) = 0;
    }
    else {
      puVar6[UFPC::length_] = UFPC::length_;
      uVar8 = UFPC::length_ + 1;
      *(uint *)(lVar28 + 8 + lVar36 * 4) = UFPC::length_;
      UFPC::length_ = uVar8;
    }
  }
  else if ((*(char *)(lVar45 + uVar32) == '\0') && (*(char *)(lVar44 + uVar32) == '\0')) {
LAB_0014a4d6:
    lVar30 = (long)(int)uVar32;
    if ((*(char *)(lVar30 + 1 + lVar45) == '\0') && (*(char *)(lVar44 + 1 + lVar30) == '\0')) {
      *(undefined4 *)(lVar28 + lVar30 * 4) = 0;
    }
    else {
      puVar6[UFPC::length_] = UFPC::length_;
      uVar8 = UFPC::length_ + 1;
      *(uint *)(lVar28 + lVar30 * 4) = UFPC::length_;
      UFPC::length_ = uVar8;
    }
  }
  else {
LAB_0014a3d3:
    puVar6[UFPC::length_] = UFPC::length_;
    uVar8 = UFPC::length_ + 1;
    *(uint *)(lVar28 + uVar32 * 4) = UFPC::length_;
    UFPC::length_ = uVar8;
  }
LAB_0014a557:
  lVar45 = 2;
  lVar44 = 1;
  lVar30 = 3;
  lVar28 = 0;
  do {
    if (*(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 <= lVar45) {
      if (this->o_rows == false) {
        return;
      }
      pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar38 = *(long *)&pMVar3->field_0x10;
      lVar27 = **(long **)&pMVar3->field_0x48;
      lVar43 = (long)(int)(uVar9 - 1);
      lVar30 = lVar38 + lVar27 * lVar43;
      lVar23 = lVar30 - lVar27;
      lVar18 = lVar23 - lVar27;
      lVar36 = *(long *)&pMVar5->field_0x10;
      lVar26 = **(long **)&pMVar5->field_0x48;
      lVar28 = lVar36 + lVar26 * lVar43;
      lVar10 = lVar28 + lVar26 * -2;
      lVar45 = lVar23 + 1;
      lVar33 = lVar18 + -1;
      lVar41 = (lVar43 + -1) * lVar27;
      lVar44 = lVar10 + 8;
      lVar11 = lVar26 * (lVar43 + -2) + lVar36 + 0x10;
      lVar36 = lVar36 + 8 + lVar26 * lVar43;
      lVar26 = lVar41 + 4 + lVar38;
      lVar1 = lVar38 + 3 + lVar27 * lVar43;
      lVar27 = (lVar43 + -2) * lVar27 + 3 + lVar38;
      uVar32 = 0xfffffffffffffffe;
LAB_0014d2f9:
      lVar43 = (long)(int)uVar32;
      uVar32 = lVar43 + 2;
      if ((int)uVar32 < iVar35) {
        if (*(char *)(lVar30 + uVar32) == '\0') goto LAB_0014d34e;
        if (*(char *)(lVar43 + 3 + lVar23) != '\0') goto LAB_0014d479;
        if (*(char *)(lVar30 + 3 + lVar43) != '\0') {
LAB_0014d369:
          uVar12 = (ulong)(int)uVar32;
          if (*(char *)(lVar23 + 2 + uVar12) == '\0') {
            if (*(char *)(lVar23 + uVar12) == '\0') goto LAB_0014d624;
            goto LAB_0014d3ab;
          }
          if (*(char *)(lVar23 + uVar12) == '\0') goto LAB_0014d619;
LAB_0014d380:
          lVar43 = (long)(int)uVar32;
          if (*(char *)(lVar18 + 1 + lVar43) == '\0') {
            uVar9 = *(uint *)(lVar10 + lVar43 * 4);
            uVar25 = *(uint *)(lVar10 + 8 + lVar43 * 4);
            goto LAB_0014d432;
          }
          uVar9 = *(uint *)(lVar44 + lVar43 * 4);
LAB_0014d43c:
          *(uint *)(lVar28 + lVar43 * 4) = uVar9;
LAB_0014d641:
          iVar40 = (int)uVar32;
          lVar22 = (long)iVar40;
          lVar14 = lVar22 << 0x20;
          lVar43 = lVar26 + lVar22;
          lVar13 = lVar11 + lVar22 * 4;
          lVar17 = lVar36 + lVar22 * 4;
          lVar16 = 0;
          do {
            uVar12 = lVar22 + lVar16 + 2;
            lVar21 = lVar14 >> 0x20;
            if (lVar4 <= (long)uVar12) {
              uVar32 = (ulong)(iVar40 + 2) + lVar16;
              if (iVar35 < (int)uVar32) {
LAB_0014dd62:
                lVar45 = (long)(int)uVar32;
                if (*(char *)(lVar30 + lVar45) == '\0') {
LAB_0014def1:
                  *(undefined4 *)(lVar28 + lVar45 * 4) = 0;
                  return;
                }
                uVar15 = *(undefined4 *)(lVar28 + -8 + lVar45 * 4);
LAB_0014dd75:
                *(undefined4 *)(lVar28 + lVar45 * 4) = uVar15;
                return;
              }
              lVar45 = lVar14 + 0x200000000 >> 0x20;
              if (*(char *)(lVar30 + lVar45) == '\0') {
                if (*(char *)(lVar30 + 3 + lVar21) == '\0') {
                  *(undefined4 *)(lVar28 + lVar45 * 4) = 0;
                  return;
                }
              }
              else if (*(char *)(lVar23 + 3 + lVar21) == '\0') {
                uVar15 = *(undefined4 *)(lVar28 + lVar21 * 4);
                goto LAB_0014debe;
              }
              uVar15 = *(undefined4 *)(lVar10 + lVar45 * 4);
LAB_0014debe:
              *(undefined4 *)(lVar28 + lVar45 * 4) = uVar15;
              return;
            }
            if (*(char *)(lVar1 + lVar22 + -1 + lVar16) == '\0') {
              uVar32 = (ulong)(iVar40 + 2) + lVar16;
              iVar40 = (int)uVar32;
              lVar43 = lVar14 + 0x300000000 >> 0x20;
              if (*(char *)(lVar30 + lVar43) == '\0') goto LAB_0014d449;
              if (*(char *)(lVar23 + lVar43) != '\0') goto LAB_0014d5e5;
              if (*(char *)(lVar23 + 4 + lVar21) == '\0') goto LAB_0014d3ab;
              goto LAB_0014d380;
            }
            iVar42 = (int)lVar16;
            if (*(char *)(lVar43 + -1 + lVar16) != '\0') {
              uVar32 = (ulong)(iVar40 + iVar42 + 2);
              *(undefined4 *)(lVar17 + lVar16 * 4) = *(undefined4 *)(lVar13 + -8 + lVar16 * 4);
              goto LAB_0014da44;
            }
            if (*(char *)(lVar1 + lVar22 + lVar16) == '\0') {
              uVar32 = (ulong)(iVar40 + iVar42 + 2);
              *(undefined4 *)(lVar17 + lVar16 * 4) = *(undefined4 *)(lVar28 + (lVar14 >> 0x1e));
              goto LAB_0014d2f9;
            }
            if (*(char *)(lVar43 + lVar16) == '\0') goto LAB_0014d7cb;
            uVar9 = *(uint *)(lVar13 + lVar16 * 4);
            if (*(char *)(lVar27 + lVar22 + lVar16) == '\0') {
              uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar17 + -8 + lVar16 * 4));
            }
            *(uint *)(lVar17 + lVar16 * 4) = uVar9;
            lVar14 = lVar14 + 0x200000000;
            lVar16 = lVar16 + 2;
          } while( true );
        }
        uVar12 = uVar32;
        if (*(char *)(lVar23 + uVar32) == '\0') {
LAB_0014d32f:
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar9 = UFPC::length_ + 1;
          *(uint *)(lVar28 + 8 + lVar43 * 4) = UFPC::length_;
          UFPC::length_ = uVar9;
          uVar32 = uVar12;
        }
        else {
LAB_0014d4d6:
          *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = *(undefined4 *)(lVar10 + 8 + lVar43 * 4);
          uVar32 = uVar12;
        }
        goto LAB_0014d2f9;
      }
      if (iVar35 < (int)uVar32) {
        if (*(char *)(lVar30 + uVar32) == '\0') {
LAB_0014df0e:
          *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = 0;
          return;
        }
      }
      else {
        if (*(char *)(lVar30 + uVar32) == '\0') {
LAB_0014e03c:
          if (*(char *)(lVar30 + 1 + uVar32) == '\0') {
LAB_0014e05d:
            *(undefined4 *)(lVar28 + uVar32 * 4) = 0;
            return;
          }
        }
        if (*(char *)(lVar23 + 1 + uVar32) != '\0') goto LAB_0014e053;
      }
      if (*(char *)(lVar23 + uVar32) == '\0') {
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar9 = UFPC::length_ + 1;
        *(uint *)(lVar28 + uVar32 * 4) = UFPC::length_;
        UFPC::length_ = uVar9;
        return;
      }
LAB_0014e053:
      uVar9 = *(uint *)(lVar10 + uVar32 * 4);
LAB_0014e0fc:
      *(uint *)(lVar28 + uVar32 * 4) = uVar9;
      return;
    }
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar1 = *(long *)&pMVar3->field_0x10;
    lVar27 = **(long **)&pMVar3->field_0x48;
    lVar41 = lVar27 * lVar45;
    lVar36 = lVar41 + lVar1;
    lVar33 = lVar36 - lVar27;
    lVar26 = lVar36 + lVar27;
    lVar38 = *(long *)&pMVar5->field_0x10;
    lVar43 = **(long **)&pMVar5->field_0x48;
    lVar10 = lVar43 * lVar45;
    lVar18 = lVar38 + lVar10;
    lVar11 = lVar18 + lVar43 * -2;
    cVar2 = *(char *)(lVar1 + lVar41);
    if (2 < (int)uVar25) {
      lVar23 = lVar33 - lVar27;
      uVar12 = 0;
      uVar32 = 0;
      if (cVar2 == '\0') goto LAB_0014a701;
LAB_0014a658:
      lVar13 = (long)(int)uVar12;
      if (*(char *)(lVar13 + 1 + lVar33) == '\0') {
        if (*(char *)(lVar36 + 1 + lVar13) != '\0') goto LAB_0014a78c;
        if (*(char *)(lVar33 + lVar13) == '\0') {
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar8 = UFPC::length_ + 1;
          *(uint *)(lVar18 + lVar13 * 4) = UFPC::length_;
          UFPC::length_ = uVar8;
          goto LAB_0014ab26;
        }
        *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
        goto LAB_0014b26b;
      }
      *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
LAB_0014c971:
      iVar40 = (int)uVar12;
      lVar37 = (long)iVar40;
      lVar24 = lVar37 << 0x20;
      lVar13 = lVar1 + lVar41 + lVar37;
      lVar29 = lVar27 * lVar44 + lVar37;
      lVar21 = lVar27 * lVar30 + lVar37;
      lVar17 = lVar10 + lVar37 * 4;
      lVar16 = lVar38 + lVar17 + 8;
      lVar22 = lVar43 * lVar28 + lVar37 * 4;
      lVar39 = lVar38 + lVar22 + 8;
      lVar14 = 0;
LAB_0014c9ec:
      uVar32 = lVar37 + lVar14 + 2;
      lVar20 = lVar24 >> 0x1e;
      lVar19 = lVar24 >> 0x20;
      iVar42 = (int)lVar14;
      if ((long)uVar32 < lVar4) {
        if (*(char *)(lVar13 + 2 + lVar14) == '\0') {
          uVar12 = (ulong)(iVar40 + 2) + lVar14;
          if (*(char *)(lVar14 + 2 + lVar21 + lVar1) == '\0') {
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_0014a74f;
          }
          lVar13 = lVar24 + 0x300000000 >> 0x20;
          lVar21 = lVar24 + 0x100000000 >> 0x20;
          if (*(char *)(lVar36 + lVar13) == '\0') {
            if (*(char *)(lVar26 + lVar21) != '\0') {
              *(undefined4 *)(lVar17 + lVar38 + 8 + lVar14 * 4) = *(undefined4 *)(lVar18 + lVar20);
              uVar32 = uVar12 & 0xffffffff;
              goto LAB_0014add7;
            }
            if (*(char *)(lVar36 + lVar21) == '\0') {
              UFPC::P_[UFPC::length_] = UFPC::length_;
              uVar8 = UFPC::length_ + 1;
              *(uint *)(lVar17 + lVar38 + 8 + lVar14 * 4) = UFPC::length_;
              UFPC::length_ = uVar8;
              uVar32 = uVar12 & 0xffffffff;
              goto LAB_0014add7;
            }
            *(undefined4 *)(lVar17 + lVar38 + 8 + lVar14 * 4) = *(undefined4 *)(lVar18 + lVar20);
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_0014add7;
          }
          if (*(char *)(lVar36 + lVar21) != '\0') {
            uVar31 = lVar24 + 0x200000000 >> 0x20;
            goto LAB_0014cb77;
          }
          if (*(char *)(lVar26 + lVar21) == '\0') goto LAB_0014a760;
          if (*(char *)(lVar33 + lVar13) != '\0') goto LAB_0014cb8b;
          if (*(char *)(lVar33 + 4 + lVar19) != '\0') {
            uVar31 = lVar24 + 0x200000000 >> 0x20;
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_0014c20e;
          }
          if (*(char *)(lVar14 + 2 + lVar29 + lVar1) == '\0') {
            *(undefined4 *)(lVar16 + lVar14 * 4) = *(undefined4 *)(lVar18 + lVar19 * 4);
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_0014b3de;
          }
LAB_0014cdd8:
          *(undefined4 *)(lVar16 + lVar14 * 4) = *(undefined4 *)(lVar22 + lVar38 + 8 + lVar14 * 4);
          uVar32 = uVar12 & 0xffffffff;
LAB_0014b926:
          lVar13 = (long)(int)uVar32;
          uVar12 = lVar13 + 2;
          if (iVar35 <= (int)uVar12) {
            if ((int)uVar12 <= iVar35) {
              uVar34 = uVar12 & 0xffffffff;
              if (*(char *)(lVar36 + uVar34) != '\0') {
LAB_0014b97d:
                if (*(char *)(lVar33 + 3 + lVar13) != '\0') {
                  if (*(char *)(lVar23 + uVar34) == '\0') {
LAB_0014c39c:
                    uVar8 = UFPC::Merge(*(uint *)(lVar11 + uVar34 * 4),
                                        *(uint *)(lVar18 + lVar13 * 4));
                    *(uint *)(lVar18 + uVar34 * 4) = uVar8;
                  }
                  else {
LAB_0014c4ee:
                    lVar36 = (long)(int)uVar12;
                    uVar8 = *(uint *)(lVar11 + lVar36 * 4);
                    if (*(char *)(lVar23 + -1 + lVar36) == '\0') {
                      uVar8 = UFPC::Merge(uVar8,*(uint *)(lVar18 + -8 + lVar36 * 4));
                      *(uint *)(lVar18 + lVar36 * 4) = uVar8;
                    }
                    else {
                      *(uint *)(lVar18 + lVar36 * 4) = uVar8;
                    }
                  }
                  goto LAB_0014c149;
                }
LAB_0014c50a:
                *(undefined4 *)(lVar18 + uVar34 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
                goto LAB_0014c149;
              }
              if (*(char *)(lVar26 + uVar34) != '\0') {
                if (*(char *)(lVar36 + 3 + lVar13) != '\0') goto LAB_0014b97d;
                goto LAB_0014c50a;
              }
LAB_0014c0d5:
              uVar8 = (uint)uVar12;
              uVar12 = (ulong)(int)uVar8;
              if (*(char *)(uVar12 + 1 + lVar36) == '\0') goto LAB_0014a997;
              cVar2 = *(char *)(lVar33 + 1 + uVar12);
              goto joined_r0x0014c0fa;
            }
LAB_0014b964:
            uVar8 = (uint)uVar12;
LAB_0014c132:
            uVar12 = (ulong)(int)uVar8;
            if (*(char *)(lVar36 + uVar12) == '\0') {
LAB_0014c13c:
              if (*(char *)(lVar26 + uVar12) != '\0') goto LAB_0014c142;
              goto LAB_0014c15e;
            }
LAB_0014c142:
            uVar15 = *(undefined4 *)(lVar18 + -8 + uVar12 * 4);
            goto LAB_0014c146;
          }
          if (*(char *)(lVar36 + uVar12) == '\0') {
            if (*(char *)(lVar26 + uVar12) == '\0') goto LAB_0014b522;
            if (*(char *)(lVar13 + 3 + lVar36) == '\0') {
LAB_0014ba41:
              *(undefined4 *)(lVar18 + 8 + lVar13 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
              uVar32 = uVar12 & 0xffffffff;
              goto LAB_0014add7;
            }
            if (*(char *)(lVar33 + 3 + lVar13) != '\0') {
              uVar32 = uVar12;
              if (*(char *)(lVar23 + uVar12) == '\0') {
                uVar8 = UFPC::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),
                                    *(uint *)(lVar18 + lVar13 * 4));
                *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
                goto LAB_0014c10f;
              }
LAB_0014beb1:
              uVar8 = *(uint *)(lVar11 + uVar12 * 4);
              if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
                uVar8 = UFPC::Merge(uVar8,*(uint *)(lVar18 + -8 + uVar12 * 4));
                *(uint *)(lVar18 + uVar12 * 4) = uVar8;
                uVar12 = uVar32;
                goto LAB_0014c10f;
              }
              *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              uVar12 = uVar32;
              goto LAB_0014c10f;
            }
          }
          else {
            if (*(char *)(lVar13 + 3 + lVar33) != '\0') {
              uVar32 = uVar12;
              if (*(char *)(lVar23 + uVar12) == '\0') {
                uVar8 = UFPC::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),
                                    *(uint *)(lVar18 + lVar13 * 4));
                *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
              }
              else {
LAB_0014bd37:
                uVar8 = *(uint *)(lVar11 + uVar12 * 4);
                if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
                  uVar8 = UFPC::Merge(uVar8,*(uint *)(lVar18 + -8 + uVar12 * 4));
                  *(uint *)(lVar18 + uVar12 * 4) = uVar8;
                  uVar12 = uVar32;
                }
                else {
                  *(uint *)(lVar18 + uVar12 * 4) = uVar8;
                  uVar12 = uVar32;
                }
              }
              goto LAB_0014c971;
            }
            if (*(char *)(lVar36 + 3 + lVar13) == '\0') goto LAB_0014ba5a;
          }
          if (*(char *)(lVar13 + 4 + lVar33) != '\0') {
            if (*(char *)(lVar23 + 3 + lVar13) == '\0') {
              uVar8 = UFPC::Merge(*(uint *)(lVar11 + 0x10 + lVar13 * 4),
                                  *(uint *)(lVar18 + lVar13 * 4));
              *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
              uVar32 = uVar12 & 0xffffffff;
              goto LAB_0014b59f;
            }
            if (*(char *)(lVar23 + uVar12) == '\0') {
              uVar8 = UFPC::Merge(*(uint *)(lVar11 + 0x10 + lVar13 * 4),
                                  *(uint *)(lVar18 + lVar13 * 4));
              *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
              uVar32 = uVar12 & 0xffffffff;
              goto LAB_0014b59f;
            }
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_0014bcb1;
          }
LAB_0014ba69:
          *(undefined4 *)(lVar18 + 8 + lVar13 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
          uVar32 = uVar12 & 0xffffffff;
LAB_0014bb42:
          iVar40 = (int)uVar32;
LAB_0014bb4c:
          lVar14 = (long)iVar40;
          lVar16 = lVar14 << 0x20;
          lVar13 = lVar1 + lVar27 * lVar44 + lVar14;
          lVar22 = lVar1 + 3 + lVar41 + lVar14;
          lVar17 = lVar10 + lVar14 * 4;
          lVar21 = lVar38 + lVar17 + 8;
          lVar24 = 0;
LAB_0014bba6:
          uVar34 = lVar14 + lVar24 + 2;
          lVar29 = lVar16 >> 0x20;
          if (lVar4 <= (long)uVar34) {
            uVar12 = (ulong)(iVar40 + 2) + lVar24;
            uVar8 = (uint)uVar12;
            if (iVar35 < (int)uVar8) goto LAB_0014c132;
            uVar34 = uVar34 & 0xffffffff;
            if (*(char *)(lVar36 + uVar34) != '\0') {
LAB_0014bda6:
              if (*(char *)(lVar33 + 3 + lVar29) == '\0') goto LAB_0014bf9b;
              if (*(char *)(lVar23 + uVar34) == '\0') {
                uVar8 = *(uint *)(lVar11 + uVar34 * 4);
                uVar7 = *(uint *)(lVar18 + lVar29 * 4);
LAB_0014b027:
                uVar8 = UFPC::Merge(uVar8,uVar7);
                *(uint *)(lVar18 + uVar34 * 4) = uVar8;
                goto LAB_0014c149;
              }
              uVar12 = uVar12 & 0xffffffff;
LAB_0014c4e0:
              lVar36 = (long)(int)uVar12;
              if (*(char *)(lVar36 + -2 + lVar33) == '\0') {
                uVar8 = UFPC::Merge(*(uint *)(lVar11 + lVar36 * 4),
                                    *(uint *)(lVar18 + -8 + lVar36 * 4));
                *(uint *)(lVar18 + lVar36 * 4) = uVar8;
                goto LAB_0014c149;
              }
              goto LAB_0014c4ee;
            }
            if (*(char *)(lVar26 + uVar34) != '\0') {
              if (*(char *)(lVar36 + 3 + lVar29) != '\0') goto LAB_0014bda6;
LAB_0014bf9b:
              uVar15 = *(undefined4 *)(lVar18 + lVar29 * 4);
LAB_0014bf9e:
              *(undefined4 *)(lVar18 + uVar34 * 4) = uVar15;
              goto LAB_0014c149;
            }
            uVar12 = uVar12 & 0xffffffff;
            goto LAB_0014c0d5;
          }
          lVar37 = lVar16 >> 0x1e;
          iVar42 = (int)lVar24;
          if (*(char *)(lVar22 + -1 + lVar24) == '\0') {
            if (*(char *)(lVar27 * lVar30 + lVar14 + lVar1 + 2 + lVar24) == '\0') {
              uVar12 = (ulong)(iVar42 + iVar40 + 2);
              goto LAB_0014b522;
            }
            if (*(char *)(lVar22 + lVar24) == '\0') {
              uVar32 = (ulong)(iVar40 + iVar42 + 2);
              *(undefined4 *)(lVar17 + lVar38 + 8 + lVar24 * 4) = *(undefined4 *)(lVar18 + lVar37);
              goto LAB_0014add7;
            }
            if (*(char *)(lVar13 + 3 + lVar24) != '\0') {
              uVar32 = (ulong)(iVar40 + 2) + lVar24;
              if (*(char *)(lVar24 + 2 + lVar27 * lVar28 + lVar14 + lVar1) == '\0') {
                uVar8 = *(uint *)(lVar43 * lVar28 + lVar14 * 4 + lVar38 + 8 + lVar24 * 4);
                uVar7 = *(uint *)(lVar18 + lVar37);
              }
              else {
                if (*(char *)(lVar33 + lVar29) != '\0') {
                  uVar12 = lVar16 + 0x200000000 >> 0x20;
                  uVar32 = uVar32 & 0xffffffff;
                  goto LAB_0014beb1;
                }
                uVar8 = *(uint *)(lVar43 * lVar28 + lVar14 * 4 + lVar38 + 8 + lVar24 * 4);
                uVar7 = *(uint *)(lVar18 + lVar29 * 4);
              }
              uVar8 = UFPC::Merge(uVar8,uVar7);
              *(uint *)(lVar21 + lVar24 * 4) = uVar8;
              uVar12 = uVar32 & 0xffffffff;
              goto LAB_0014c10f;
            }
          }
          else {
            if (*(char *)(lVar13 + 3 + lVar24) != '\0') {
              uVar32 = (ulong)(iVar40 + 2) + lVar24;
              if (*(char *)(lVar24 + 2 + lVar27 * lVar28 + lVar14 + lVar1) == '\0') {
                uVar8 = *(uint *)(lVar43 * lVar28 + lVar14 * 4 + lVar38 + 8 + lVar24 * 4);
                uVar7 = *(uint *)(lVar18 + lVar37);
              }
              else {
                if (*(char *)(lVar33 + lVar29) != '\0') {
                  uVar12 = lVar16 + 0x200000000 >> 0x20;
                  uVar32 = uVar32 & 0xffffffff;
                  goto LAB_0014bd37;
                }
                uVar8 = *(uint *)(lVar43 * lVar28 + lVar14 * 4 + lVar38 + 8 + lVar24 * 4);
                uVar7 = *(uint *)(lVar18 + lVar29 * 4);
              }
              uVar8 = UFPC::Merge(uVar8,uVar7);
              *(uint *)(lVar21 + lVar24 * 4) = uVar8;
LAB_0014bfd5:
              uVar12 = uVar32 & 0xffffffff;
              goto LAB_0014c971;
            }
            if (*(char *)(lVar22 + lVar24) == '\0') {
              iVar40 = iVar40 + iVar42 + 2;
              *(undefined4 *)(lVar17 + lVar38 + 8 + lVar24 * 4) = *(undefined4 *)(lVar18 + lVar37);
              goto LAB_0014c261;
            }
          }
          if (*(char *)(lVar13 + 4 + lVar24) == '\0') goto code_r0x0014bbfc;
          uVar32 = (ulong)(iVar40 + 2) + lVar24;
          if (*(char *)(lVar23 + 3 + lVar29) == '\0') {
            uVar8 = UFPC::Merge(*(uint *)(lVar43 * lVar28 + lVar14 * 4 + lVar38 + 0x10 + lVar24 * 4)
                                ,*(uint *)(lVar18 + lVar29 * 4));
          }
          else {
            if ((*(char *)(lVar24 + 2 + lVar27 * lVar28 + lVar14 + lVar1) != '\0') &&
               (*(char *)(lVar33 + lVar29) != '\0')) {
              uVar12 = lVar16 + 0x200000000 >> 0x20;
LAB_0014bcb1:
              uVar8 = *(uint *)(lVar11 + 8 + uVar12 * 4);
              if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
                uVar8 = UFPC::Merge(uVar8,*(uint *)(lVar18 + -8 + uVar12 * 4));
                *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              }
              else {
                *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              }
              goto LAB_0014b59f;
            }
            uVar8 = UFPC::Merge(*(uint *)(lVar43 * lVar28 + lVar14 * 4 + lVar38 + 0x10 + lVar24 * 4)
                                ,*(uint *)(lVar18 + lVar29 * 4));
          }
          *(uint *)(lVar21 + lVar24 * 4) = uVar8;
LAB_0014b59f:
          iVar40 = (int)uVar32;
          lVar39 = (long)iVar40;
          lVar16 = lVar39 << 0x20;
          lVar13 = lVar10 + lVar39 * 4;
          lVar24 = lVar13 + lVar38 + 8;
          lVar14 = lVar27 * lVar44 + lVar39 + lVar1;
          lVar17 = lVar43 * lVar28 + lVar39 * 4 + lVar38;
          lVar29 = lVar17 + 8;
          lVar22 = lVar41 + lVar39 + lVar1;
          lVar21 = lVar22 + 3;
          lVar37 = 0;
          do {
            uVar12 = lVar39 + lVar37 + 2;
            lVar19 = lVar16 >> 0x20;
            iVar42 = (int)lVar37;
            if (lVar4 <= (long)uVar12) {
              uVar8 = iVar40 + 2 + iVar42;
              if (iVar35 < (int)uVar8) goto LAB_0014c132;
              uVar12 = uVar12 & 0xffffffff;
              if (*(char *)(lVar36 + uVar12) == '\0') {
                cVar2 = *(char *)(lVar36 + 3 + lVar19);
                if (*(char *)(lVar26 + uVar12) == '\0') {
                  if (cVar2 == '\0') goto LAB_0014a997;
                  goto LAB_0014a696;
                }
                if (cVar2 != '\0') goto LAB_0014b7ff;
              }
              else {
LAB_0014b7ff:
                if (*(char *)(lVar33 + 3 + lVar19) != '\0') goto LAB_0014a696;
              }
              uVar15 = *(undefined4 *)(lVar18 + lVar19 * 4);
              goto LAB_0014c146;
            }
            lVar20 = lVar16 >> 0x1e;
            if (*(char *)(lVar22 + 2 + lVar37) == '\0') {
              if (*(char *)(lVar27 * lVar30 + lVar39 + lVar1 + 2 + lVar37) == '\0') {
                uVar32 = (ulong)(iVar40 + 2) + lVar37;
                iVar40 = (int)uVar32;
                lVar13 = lVar16 + 0x300000000 >> 0x20;
                if (*(char *)(lVar36 + lVar13) == '\0') goto LAB_0014a846;
                if (*(char *)(lVar33 + lVar13) != '\0') {
                  *(undefined4 *)(lVar24 + lVar37 * 4) = *(undefined4 *)(lVar29 + lVar37 * 4);
                  uVar12 = uVar32 & 0xffffffff;
                  goto LAB_0014c10f;
                }
                if (*(char *)(lVar33 + 4 + lVar19) != '\0') goto LAB_0014a79d;
                *(undefined4 *)(lVar24 + lVar37 * 4) = *(undefined4 *)(lVar29 + lVar37 * 4);
                goto LAB_0014b926;
              }
              if (*(char *)(lVar21 + lVar37) == '\0') {
                uVar32 = (ulong)(iVar40 + iVar42 + 2);
                *(undefined4 *)(lVar13 + lVar38 + 8 + lVar37 * 4) = *(undefined4 *)(lVar18 + lVar20)
                ;
                goto LAB_0014add7;
              }
              if (*(char *)(lVar14 + 3 + lVar37) != '\0') {
                uVar12 = (ulong)(iVar40 + iVar42 + 2);
                *(undefined4 *)(lVar24 + lVar37 * 4) = *(undefined4 *)(lVar29 + lVar37 * 4);
                goto LAB_0014c10f;
              }
            }
            else {
              if (*(char *)(lVar14 + 3 + lVar37) != '\0') {
                *(undefined4 *)(lVar24 + lVar37 * 4) = *(undefined4 *)(lVar29 + lVar37 * 4);
                uVar12 = (ulong)(iVar40 + iVar42 + 2);
                goto LAB_0014c971;
              }
              if (*(char *)(lVar21 + lVar37) == '\0') goto LAB_0014b7ad;
            }
            if (*(char *)(lVar14 + 4 + lVar37) == '\0') {
              iVar40 = iVar40 + iVar42 + 2;
              *(undefined4 *)(lVar13 + lVar38 + 8 + lVar37 * 4) = *(undefined4 *)(lVar18 + lVar20);
              goto LAB_0014bb4c;
            }
            uVar8 = *(uint *)(lVar17 + 0x10 + lVar37 * 4);
            if (*(char *)(lVar27 * lVar28 + lVar39 + lVar1 + 3 + lVar37) == '\0') {
              uVar8 = UFPC::Merge(uVar8,*(uint *)(lVar13 + lVar38 + lVar37 * 4));
            }
            *(uint *)(lVar24 + lVar37 * 4) = uVar8;
            lVar16 = lVar16 + 0x200000000;
            lVar37 = lVar37 + 2;
          } while( true );
        }
        if ((*(char *)(lVar13 + 1 + lVar14) != '\0') ||
           (*(char *)(lVar1 + lVar21 + 1 + lVar14) != '\0')) {
          uVar32 = (ulong)(iVar40 + iVar42 + 2);
          goto LAB_0014c1c2;
        }
        if (*(char *)(lVar1 + lVar29 + 3 + lVar14) == '\0') {
          uVar12 = (ulong)(iVar40 + 2) + lVar14;
          if (*(char *)(lVar14 + 3 + lVar41 + lVar37 + lVar1) == '\0') {
            if (*(char *)(lVar14 + 2 + lVar29 + lVar1) == '\0') {
              *(undefined4 *)(lVar17 + lVar38 + 8 + lVar14 * 4) = *(undefined4 *)(lVar11 + lVar20);
              goto LAB_0014ab26;
            }
            *(undefined4 *)(lVar16 + lVar14 * 4) = *(undefined4 *)(lVar39 + lVar14 * 4);
            goto LAB_0014b26b;
          }
          cVar2 = *(char *)(lVar14 + 2 + lVar29 + lVar1);
          if (*(char *)(lVar33 + 4 + lVar19) != '\0') {
            if (cVar2 != '\0') {
              uVar32 = uVar12 & 0xffffffff;
              goto LAB_0014a79d;
            }
            uVar31 = lVar24 + 0x200000000 >> 0x20;
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_0014cf0f;
          }
          if (cVar2 == '\0') {
            *(undefined4 *)(lVar16 + lVar14 * 4) = *(undefined4 *)(lVar11 + lVar19 * 4);
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_0014b3de;
          }
          goto LAB_0014cdd8;
        }
        if (*(char *)(lVar1 + lVar29 + 2 + lVar14) != '\0') goto code_r0x0014ca32;
        uVar12 = (ulong)(iVar40 + iVar42 + 2);
        lVar13 = lVar24 + 0x200000000 >> 0x20;
LAB_0014cc41:
        if (*(char *)(lVar23 + lVar13) == '\0') {
          uVar8 = UFPC::Merge(*(uint *)(lVar11 + -8 + lVar13 * 4),*(uint *)(lVar11 + lVar13 * 4));
          *(uint *)(lVar18 + lVar13 * 4) = uVar8;
        }
        else {
          *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
        }
        goto LAB_0014c971;
      }
      uVar31 = (ulong)(iVar40 + 2) + lVar14;
      uVar12 = uVar32 & 0xffffffff;
      uVar8 = (uint)uVar31;
      if ((int)uVar8 <= iVar35) {
        if (*(char *)(lVar36 + uVar12) != '\0') {
          uVar32 = (ulong)(iVar42 + iVar40 + 1);
          if ((*(char *)(lVar36 + uVar32) == '\0') && (*(char *)(lVar26 + uVar32) == '\0')) {
            if (*(char *)(lVar33 + 3 + lVar19) == '\0') goto LAB_0014d0ca;
            if (*(char *)(lVar33 + uVar12) != '\0') goto LAB_0014d0d5;
            lVar36 = lVar24 + 0x200000000 >> 0x20;
LAB_0014af62:
            if (*(char *)(lVar23 + lVar36) == '\0') {
              uVar8 = UFPC::Merge(*(uint *)(lVar11 + -8 + lVar36 * 4),*(uint *)(lVar11 + lVar36 * 4)
                                 );
              *(uint *)(lVar18 + lVar36 * 4) = uVar8;
              goto LAB_0014c149;
            }
            goto LAB_0014ccd6;
          }
          goto LAB_0014ccc4;
        }
        if (*(char *)(lVar26 + uVar12) == '\0') {
          uVar31 = uVar31 & 0xffffffff;
          goto LAB_0014a981;
        }
        uVar34 = (ulong)(iVar40 + iVar42 + 3);
        if (*(char *)(lVar36 + uVar34) == '\0') goto LAB_0014cea6;
        uVar32 = (ulong)(iVar42 + iVar40 + 1);
        if (*(char *)(lVar36 + uVar32) != '\0') goto LAB_0014ccc4;
        if (*(char *)(lVar26 + uVar32) == '\0') goto LAB_0014a5fc;
        if (*(char *)(lVar33 + uVar34) == '\0') {
          if (*(char *)(lVar33 + uVar12) == '\0') goto LAB_0014cfad;
          goto LAB_0014d0d5;
        }
        lVar36 = lVar24 + 0x200000000 >> 0x20;
        goto LAB_0014cccf;
      }
      if (*(char *)(lVar36 + uVar12) == '\0') {
        if (*(char *)(lVar26 + uVar12) == '\0') {
          *(undefined4 *)(lVar18 + uVar12 * 4) = 0;
          goto LAB_0014c149;
        }
LAB_0014cea6:
        uVar12 = (ulong)(iVar42 + iVar40 + 1);
        if ((*(char *)(lVar26 + uVar12) == '\0') && (*(char *)(lVar36 + uVar12) == '\0')) {
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar32 = uVar32 & 0xffffffff;
          uVar8 = UFPC::length_;
          UFPC::length_ = UFPC::length_ + 1;
LAB_0014d194:
          *(uint *)(lVar18 + uVar32 * 4) = uVar8;
          goto LAB_0014c149;
        }
        uVar15 = *(undefined4 *)(lVar18 + lVar20);
        uVar12 = uVar32 & 0xffffffff;
      }
      else {
        uVar32 = (ulong)(iVar42 + iVar40 + 1);
        if ((*(char *)(lVar36 + uVar32) == '\0') && (*(char *)(lVar26 + uVar32) == '\0')) {
LAB_0014d0ca:
          if (*(char *)(lVar33 + uVar12) == '\0') {
            uVar15 = *(undefined4 *)(lVar11 + lVar20);
          }
          else {
LAB_0014d0d5:
            uVar15 = *(undefined4 *)(lVar11 + uVar12 * 4);
          }
        }
        else {
LAB_0014cfad:
          uVar15 = *(undefined4 *)(lVar18 + lVar20);
        }
      }
LAB_0014d1a8:
      *(undefined4 *)(lVar18 + uVar12 * 4) = uVar15;
      goto LAB_0014c149;
    }
    if (uVar25 == 2) {
      uVar32 = 0;
      uVar8 = 0;
      if (cVar2 == '\0') {
LAB_0014a962:
        uVar8 = (uint)uVar32;
        uVar12 = (ulong)(int)uVar8;
        if (*(char *)(lVar26 + uVar12) == '\0') {
LAB_0014a97e:
          uVar31 = uVar32 & 0xffffffff;
LAB_0014a981:
          uVar8 = (uint)uVar31;
          if (*(char *)(lVar36 + 1 + (long)(int)uVar8) != '\0') goto LAB_0014a5fc;
LAB_0014a997:
          uVar12 = (ulong)(int)uVar8;
          if (*(char *)(lVar26 + 1 + uVar12) == '\0') goto LAB_0014c15e;
        }
        else if (*(char *)(lVar36 + 1 + uVar12) != '\0') goto LAB_0014a5fc;
LAB_0014a9a5:
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar8 = UFPC::length_ + 1;
        *(uint *)(lVar18 + uVar12 * 4) = UFPC::length_;
        UFPC::length_ = uVar8;
      }
      else {
LAB_0014a5fc:
        uVar12 = (ulong)(int)uVar8;
        uVar31 = (ulong)uVar8;
        if (*(char *)(lVar33 + 1 + uVar12) == '\0') goto LAB_0014a688;
LAB_0014a696:
        uVar15 = *(undefined4 *)(lVar11 + uVar12 * 4);
LAB_0014c146:
        *(undefined4 *)(lVar18 + uVar12 * 4) = uVar15;
      }
    }
    else {
      uVar31 = 0;
      uVar32 = 0;
      if (cVar2 != '\0') {
LAB_0014a688:
        uVar12 = (ulong)(int)uVar31;
        cVar2 = *(char *)(lVar33 + uVar12);
joined_r0x0014c0fa:
        if (cVar2 == '\0') goto LAB_0014a9a5;
        goto LAB_0014a696;
      }
LAB_0014a90b:
      uVar12 = (ulong)(int)uVar32;
      if (*(char *)(lVar26 + uVar12) != '\0') goto LAB_0014a9a5;
LAB_0014c15e:
      *(undefined4 *)(lVar18 + uVar12 * 4) = 0;
    }
LAB_0014c149:
    lVar45 = lVar45 + 2;
    lVar28 = lVar28 + 2;
    lVar44 = lVar44 + 2;
    lVar30 = lVar30 + 2;
  } while( true );
LAB_0014a54e:
  *(undefined4 *)(lVar28 + uVar32 * 4) = *(undefined4 *)(lVar28 + -8 + uVar32 * 4);
  goto LAB_0014a557;
LAB_0014d7cb:
  uVar32 = (ulong)(iVar40 + iVar42 + 2);
  *(undefined4 *)(lVar17 + lVar16 * 4) = *(undefined4 *)(lVar28 + (lVar14 >> 0x1e));
LAB_0014d83a:
  iVar40 = (int)uVar32;
  lVar13 = (long)iVar40;
  lVar14 = lVar13 << 0x20;
  lVar17 = lVar26 + lVar13;
  lVar43 = lVar36 + lVar13 * 4;
  lVar22 = 0;
LAB_0014d863:
  lVar16 = lVar14 >> 0x20;
  if (lVar4 <= lVar13 + lVar22 + 2) {
    uVar12 = (ulong)(iVar40 + 2) + lVar22;
    if (iVar35 < (int)uVar12) {
      uVar32 = uVar12 & 0xffffffff;
      goto LAB_0014dd62;
    }
    uVar32 = lVar14 + 0x200000000 >> 0x20;
    if (*(char *)(lVar30 + uVar32) == '\0') {
      uVar32 = uVar12 & 0xffffffff;
LAB_0014ded1:
      lVar45 = (long)(int)uVar32;
      if (*(char *)(lVar45 + 1 + lVar30) == '\0') goto LAB_0014def1;
      if (*(char *)(lVar23 + 1 + lVar45) == '\0') {
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar9 = UFPC::length_ + 1;
        *(uint *)(lVar28 + lVar45 * 4) = UFPC::length_;
        UFPC::length_ = uVar9;
        return;
      }
      uVar15 = *(undefined4 *)(lVar10 + lVar45 * 4);
      goto LAB_0014dd75;
    }
    if (*(char *)(lVar23 + 3 + lVar16) == '\0') {
      uVar9 = *(uint *)(lVar28 + lVar16 * 4);
      goto LAB_0014e0fc;
    }
    if ((*(char *)(lVar18 + uVar32) != '\0') && (*(char *)(lVar23 + lVar16) != '\0'))
    goto LAB_0014de73;
    uVar9 = *(uint *)(lVar10 + uVar32 * 4);
    uVar25 = *(uint *)(lVar28 + lVar16 * 4);
    goto LAB_0014e0f7;
  }
  if (*(char *)(lVar1 + lVar13 + -1 + lVar22) == '\0') {
    uVar32 = (ulong)(iVar40 + (int)lVar22 + 2);
    goto LAB_0014d5ce;
  }
  lVar21 = lVar14 >> 0x1e;
  if (*(char *)(lVar17 + -1 + lVar22) != '\0') goto LAB_0014d8cd;
  if (*(char *)(lVar1 + lVar13 + lVar22) == '\0') {
    uVar32 = (ulong)(iVar40 + (int)lVar22 + 2);
    *(undefined4 *)(lVar43 + lVar22 * 4) = *(undefined4 *)(lVar28 + lVar21);
    goto LAB_0014d2f9;
  }
  if (*(char *)(lVar17 + lVar22) == '\0') {
    *(undefined4 *)(lVar43 + lVar22 * 4) = *(undefined4 *)(lVar43 + -8 + lVar22 * 4);
    lVar14 = lVar14 + 0x200000000;
    lVar22 = lVar22 + 2;
    goto LAB_0014d863;
  }
  uVar32 = (ulong)(iVar40 + 2) + lVar22;
  if ((*(char *)(lVar22 + lVar27 + lVar13) == '\0') ||
     (*(char *)(lVar22 + -1 + lVar27 + lVar13) == '\0')) {
    uVar9 = *(uint *)(lVar11 + lVar13 * 4 + lVar22 * 4);
    uVar25 = *(uint *)(lVar28 + lVar21);
  }
  else {
    if (*(char *)(lVar23 + lVar16) != '\0') {
      uVar12 = lVar14 + 0x200000000 >> 0x20;
LAB_0014d98a:
      uVar9 = *(uint *)(lVar44 + uVar12 * 4);
      if (*(char *)(lVar33 + uVar12) == '\0') {
        uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar28 + -8 + uVar12 * 4));
        *(uint *)(lVar28 + uVar12 * 4) = uVar9;
      }
      else {
        *(uint *)(lVar28 + uVar12 * 4) = uVar9;
      }
      goto LAB_0014d641;
    }
    uVar9 = *(uint *)(lVar11 + lVar13 * 4 + lVar22 * 4);
    uVar25 = *(uint *)(lVar28 + lVar16 * 4);
  }
  uVar9 = UFPC::Merge(uVar9,uVar25);
  *(uint *)(lVar43 + lVar22 * 4) = uVar9;
  goto LAB_0014d641;
LAB_0014d8cd:
  uVar32 = (ulong)(iVar40 + 2) + lVar22;
  if (*(char *)(lVar22 + -1 + lVar27 + lVar13) == '\0') {
    uVar9 = *(uint *)(lVar11 + lVar13 * 4 + -8 + lVar22 * 4);
    uVar25 = *(uint *)(lVar28 + lVar21);
  }
  else {
    if (*(char *)(lVar23 + lVar16) != '\0') {
      lVar13 = lVar33;
      uVar12 = lVar14 + 0x200000000 >> 0x20;
      goto LAB_0014dbea;
    }
    uVar9 = *(uint *)(lVar11 + lVar13 * 4 + -8 + lVar22 * 4);
    uVar25 = *(uint *)(lVar28 + lVar16 * 4);
  }
  uVar9 = UFPC::Merge(uVar9,uVar25);
  *(uint *)(lVar43 + lVar22 * 4) = uVar9;
LAB_0014da44:
  iVar40 = (int)uVar32;
  lVar14 = (long)iVar40;
  lVar43 = lVar11 + lVar14 * 4;
  lVar13 = lVar41 + 2 + lVar38 + lVar14;
  lVar16 = lVar14 << 0x20;
  lVar17 = lVar36 + lVar14 * 4;
  lVar22 = 0;
LAB_0014da78:
  uVar12 = lVar14 + lVar22 + 2;
  iVar42 = (int)lVar22;
  if (lVar4 <= (long)uVar12) {
    uVar32 = lVar16 + 0x200000000 >> 0x20;
    lVar45 = lVar16 >> 0x20;
    if (iVar35 < iVar42 + iVar40 + 2) {
      if (*(char *)(lVar30 + uVar32) == '\0') goto LAB_0014e05d;
      if (*(char *)(lVar30 + 1 + lVar45) != '\0') {
        uVar9 = *(uint *)(lVar28 + lVar45 * 4);
        goto LAB_0014e0fc;
      }
    }
    else {
      if (*(char *)(lVar30 + uVar32) == '\0') goto LAB_0014e03c;
      if (*(char *)(lVar30 + 1 + lVar45) != '\0') goto LAB_0014dda2;
      if (*(char *)(lVar23 + 3 + lVar45) != '\0') {
        if (*(char *)(lVar23 + uVar32) != '\0') goto LAB_0014e053;
LAB_0014dfbe:
        cVar2 = *(char *)(lVar18 + uVar32);
        goto joined_r0x0014dfc8;
      }
    }
    if (*(char *)(lVar23 + uVar32) != '\0') goto LAB_0014e053;
    uVar9 = *(uint *)(lVar10 + (lVar16 >> 0x1e));
    goto LAB_0014e0fc;
  }
  if (*(char *)(lVar1 + lVar14 + -1 + lVar22) == '\0') {
    uVar32 = (ulong)(iVar40 + iVar42 + 2);
    goto LAB_0014d34e;
  }
  if (*(char *)(lVar1 + lVar14 + -2 + lVar22) == '\0') {
    if (*(char *)(lVar13 + 1 + lVar22) != '\0') {
      if (*(char *)(lVar13 + lVar22) == '\0') goto LAB_0014dbcd;
      *(undefined4 *)(lVar17 + lVar22 * 4) = *(undefined4 *)(lVar43 + -8 + lVar22 * 4);
      lVar22 = lVar22 + 2;
      lVar16 = lVar16 + 0x200000000;
      goto LAB_0014da78;
    }
    uVar32 = (ulong)(iVar40 + 2) + lVar22;
    if (*(char *)(lVar1 + lVar14 + lVar22) == '\0') {
      if (*(char *)(lVar22 + lVar13) == '\0') {
        uVar15 = *(undefined4 *)(lVar43 + -0x10 + lVar22 * 4);
      }
      else {
        uVar15 = *(undefined4 *)(lVar43 + -8 + lVar22 * 4);
      }
      *(undefined4 *)(lVar17 + lVar22 * 4) = uVar15;
      goto LAB_0014d2f9;
    }
    if (*(char *)(lVar22 + 2 + lVar13) == '\0') {
      if (*(char *)(lVar22 + lVar13) != '\0') goto LAB_0014d3ab;
      uVar31 = (ulong)*(uint *)(lVar43 + -0x10 + lVar22 * 4);
      goto LAB_0014d547;
    }
    if (*(char *)(lVar22 + lVar13) != '\0') goto LAB_0014d380;
    uVar12 = uVar32;
    uVar32 = lVar16 + 0x200000000 >> 0x20;
LAB_0014dba5:
    if ((*(char *)(lVar18 + 1 + uVar32) == '\0') || (*(char *)(lVar18 + uVar32) == '\0')) {
      uVar9 = UFPC::Merge(*(uint *)(lVar10 + -8 + uVar32 * 4),*(uint *)(lVar10 + 8 + uVar32 * 4));
    }
    else {
      uVar9 = *(uint *)(lVar44 + uVar32 * 4);
    }
    *(uint *)(lVar28 + uVar32 * 4) = uVar9;
    uVar32 = uVar12;
    goto LAB_0014d641;
  }
  uVar32 = (ulong)(iVar40 + iVar42 + 2);
LAB_0014daf8:
  lVar43 = (long)(int)uVar32;
  if (*(char *)(lVar43 + 1 + lVar23) != '\0') {
    if (*(char *)(lVar23 + lVar43) == '\0') {
      uVar9 = *(uint *)(lVar10 + lVar43 * 4);
      if (*(char *)(lVar18 + lVar43) != '\0') {
        *(uint *)(lVar28 + lVar43 * 4) = uVar9;
        goto LAB_0014da44;
      }
      uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar28 + -8 + lVar43 * 4));
    }
    else {
      uVar9 = *(uint *)(lVar10 + lVar43 * 4);
    }
    *(uint *)(lVar28 + lVar43 * 4) = uVar9;
    goto LAB_0014da44;
  }
  if (*(char *)(lVar30 + 1 + lVar43) == '\0') {
    *(undefined4 *)(lVar28 + lVar43 * 4) = *(undefined4 *)(lVar28 + -8 + lVar43 * 4);
    goto LAB_0014d2f9;
  }
  if (*(char *)(lVar43 + 2 + lVar23) == '\0') {
    *(undefined4 *)(lVar28 + lVar43 * 4) = *(undefined4 *)(lVar28 + -8 + lVar43 * 4);
    goto LAB_0014d83a;
  }
  if (*(char *)(lVar18 + 1 + lVar43) == '\0') {
    uVar9 = *(uint *)(lVar10 + 8 + lVar43 * 4);
  }
  else {
    if (*(char *)(lVar23 + lVar43) != '\0') {
      uVar9 = *(uint *)(lVar10 + 8 + lVar43 * 4);
      goto LAB_0014d43c;
    }
    uVar9 = *(uint *)(lVar10 + 8 + lVar43 * 4);
    if (*(char *)(lVar18 + lVar43) != '\0') {
      *(uint *)(lVar28 + lVar43 * 4) = uVar9;
      goto LAB_0014d641;
    }
  }
  uVar25 = *(uint *)(lVar28 + -8 + lVar43 * 4);
LAB_0014d432:
  uVar9 = UFPC::Merge(uVar9,uVar25);
  goto LAB_0014d43c;
LAB_0014dbcd:
  uVar12 = lVar16 + 0x200000000 >> 0x20;
  lVar13 = lVar18;
  uVar32 = (ulong)(iVar40 + iVar42 + 2);
LAB_0014dbea:
  if (*(char *)(lVar13 + uVar12) == '\0') {
    uVar9 = UFPC::Merge(*(uint *)(lVar10 + -8 + uVar12 * 4),*(uint *)(lVar10 + uVar12 * 4));
  }
  else {
    uVar9 = *(uint *)(lVar10 + uVar12 * 4);
  }
  *(uint *)(lVar28 + uVar12 * 4) = uVar9;
  goto LAB_0014da44;
LAB_0014d547:
  *(int *)(lVar28 + uVar12 * 4) = (int)uVar31;
  lVar43 = (long)(int)uVar32;
  uVar32 = lVar43 + 2;
  if (iVar35 <= (int)uVar32) {
    if (iVar35 < (int)uVar32) goto LAB_0014dd62;
    if (*(char *)(lVar30 + uVar32) != '\0') {
      if (*(char *)(lVar23 + 3 + lVar43) == '\0') {
LAB_0014e0d8:
        uVar9 = *(uint *)(lVar28 + lVar43 * 4);
      }
      else {
LAB_0014df5d:
        uVar9 = UFPC::Merge(*(uint *)(lVar10 + 8 + lVar43 * 4),*(uint *)(lVar28 + lVar43 * 4));
      }
      *(uint *)(lVar28 + 8 + lVar43 * 4) = uVar9;
      return;
    }
    goto LAB_0014ded1;
  }
  if (*(char *)(lVar30 + uVar32) == '\0') {
LAB_0014d5ce:
    iVar40 = (int)uVar32;
    uVar12 = (ulong)iVar40;
    if (*(char *)(uVar12 + 1 + lVar30) == '\0') goto LAB_0014d446;
    if (*(char *)(lVar23 + 1 + uVar12) != '\0') {
LAB_0014d5e5:
      do {
        *(undefined4 *)(lVar28 + uVar12 * 4) = *(undefined4 *)(lVar10 + uVar12 * 4);
        uVar32 = (long)(int)uVar32 + 2;
        if (iVar35 <= (int)uVar32) {
          if (iVar35 < (int)uVar32) goto LAB_0014dd62;
          if (*(char *)(lVar30 + uVar32) == '\0') goto LAB_0014e03c;
          goto LAB_0014dda2;
        }
        if (*(char *)(lVar30 + uVar32) != '\0') goto LAB_0014daf8;
LAB_0014d34e:
        while( true ) {
          iVar40 = (int)uVar32;
          uVar12 = (ulong)iVar40;
          if (*(char *)(uVar12 + 1 + lVar30) != '\0') break;
LAB_0014d446:
          uVar12 = (ulong)iVar40;
LAB_0014d449:
          *(undefined4 *)(lVar28 + uVar12 * 4) = 0;
          lVar43 = (long)iVar40;
          uVar12 = lVar43 + 2;
          uVar32 = uVar12;
          if (iVar35 <= (int)uVar12) {
            if (iVar35 < (int)uVar12) {
              if (*(char *)(lVar30 + uVar12) == '\0') goto LAB_0014df0e;
LAB_0014e0a7:
              if (*(char *)(lVar23 + uVar12) == '\0') {
                if (*(char *)(lVar23 + 1 + lVar43) == '\0') {
                  UFPC::P_[UFPC::length_] = UFPC::length_;
                  uVar9 = UFPC::length_ + 1;
                  *(uint *)(lVar28 + 8 + lVar43 * 4) = UFPC::length_;
                  UFPC::length_ = uVar9;
                  return;
                }
                uVar15 = *(undefined4 *)(lVar10 + lVar43 * 4);
                goto LAB_0014e0b2;
              }
            }
            else {
              if (*(char *)(lVar30 + uVar12) == '\0') goto LAB_0014e03c;
              if (*(char *)(lVar23 + 3 + lVar43) == '\0') goto LAB_0014e0a7;
              if ((*(char *)(lVar23 + uVar12) == '\0') && (*(char *)(lVar23 + 1 + lVar43) != '\0'))
              goto LAB_0014dfbe;
            }
            uVar15 = *(undefined4 *)(lVar10 + 8 + lVar43 * 4);
LAB_0014e0b2:
            *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = uVar15;
            return;
          }
          if (*(char *)(lVar30 + uVar12) != '\0') {
            if (*(char *)(lVar43 + 3 + lVar23) != '\0') {
              if ((*(char *)(lVar23 + uVar12) != '\0') ||
                 (lVar13 = lVar18, *(char *)(lVar45 + lVar43) == '\0')) goto LAB_0014d479;
              goto LAB_0014dbea;
            }
            if (*(char *)(lVar30 + 3 + lVar43) == '\0') {
              if (*(char *)(lVar23 + uVar12) != '\0') goto LAB_0014d4d6;
              if (*(char *)(lVar45 + lVar43) == '\0') goto LAB_0014d32f;
              *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = *(undefined4 *)(lVar10 + lVar43 * 4);
              goto LAB_0014d2f9;
            }
            cVar2 = *(char *)(lVar43 + 2 + lVar23);
            if (*(char *)(lVar43 + 4 + lVar23) == '\0') {
              if (cVar2 != '\0') goto LAB_0014d3ab;
              if (*(char *)(lVar45 + lVar43) == '\0') {
                uVar31 = (ulong)UFPC::length_;
                UFPC::P_[uVar31] = UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
              }
              else {
                uVar31 = (ulong)*(uint *)(lVar10 + lVar43 * 4);
              }
              goto LAB_0014d547;
            }
            if (cVar2 != '\0') goto LAB_0014d380;
            if (*(char *)(lVar45 + lVar43) != '\0') goto LAB_0014dba5;
            *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = *(undefined4 *)(lVar10 + 0x10 + lVar43 * 4);
            goto LAB_0014d641;
          }
        }
      } while (*(char *)(lVar23 + 1 + uVar12) != '\0');
      goto LAB_0014d369;
    }
    uVar12 = (ulong)iVar40;
    if (*(char *)(uVar12 + 2 + lVar23) == '\0') goto LAB_0014d624;
LAB_0014d619:
    *(undefined4 *)(lVar28 + uVar12 * 4) = *(undefined4 *)(lVar10 + 8 + uVar12 * 4);
    goto LAB_0014d641;
  }
  if (*(char *)(lVar43 + 3 + lVar23) != '\0') {
LAB_0014d56b:
    uVar9 = UFPC::Merge(*(uint *)(lVar10 + 8 + lVar43 * 4),*(uint *)(lVar28 + lVar43 * 4));
    *(uint *)(lVar28 + 8 + lVar43 * 4) = uVar9;
    goto LAB_0014da44;
  }
  if (*(char *)(lVar30 + 3 + lVar43) == '\0') {
LAB_0014d5b0:
    *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = *(undefined4 *)(lVar28 + lVar43 * 4);
    goto LAB_0014d2f9;
  }
  if (*(char *)(lVar43 + 4 + lVar23) != '\0') goto LAB_0014d593;
LAB_0014d5bf:
  *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = *(undefined4 *)(lVar28 + lVar43 * 4);
  goto LAB_0014d83a;
LAB_0014dda2:
  if (*(char *)(lVar23 + 1 + uVar32) == '\0') {
    uVar9 = *(uint *)(lVar28 + -8 + uVar32 * 4);
    goto LAB_0014e0fc;
  }
  if (*(char *)(lVar23 + uVar32) != '\0') goto LAB_0014e053;
  uVar9 = *(uint *)(lVar10 + uVar32 * 4);
  if (*(char *)(lVar18 + uVar32) != '\0') {
    *(uint *)(lVar28 + uVar32 * 4) = uVar9;
    return;
  }
  uVar25 = *(uint *)(lVar28 + -8 + uVar32 * 4);
  goto LAB_0014e0f7;
LAB_0014d479:
  *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = *(undefined4 *)(lVar10 + 8 + lVar43 * 4);
  goto LAB_0014da44;
LAB_0014d3ab:
  *(undefined4 *)(lVar28 + uVar12 * 4) = *(undefined4 *)(lVar10 + uVar12 * 4);
  lVar43 = (long)(int)uVar32;
  uVar32 = lVar43 + 2;
  if (iVar35 <= (int)uVar32) {
    if (iVar35 < (int)uVar32) goto LAB_0014dd62;
    if (*(char *)(lVar30 + uVar32) == '\0') goto LAB_0014ded1;
    if (*(char *)(lVar23 + 3 + lVar43) == '\0') goto LAB_0014e0d8;
    if (*(char *)(lVar18 + uVar32) == '\0') goto LAB_0014df5d;
    goto LAB_0014de73;
  }
  if (*(char *)(lVar30 + uVar32) != '\0') {
    if (*(char *)(lVar43 + 3 + lVar23) != '\0') {
      lVar13 = lVar33;
      uVar12 = uVar32;
      if (*(char *)(lVar18 + uVar32) != '\0') goto LAB_0014dbea;
      goto LAB_0014d56b;
    }
    if (*(char *)(lVar30 + 3 + lVar43) == '\0') goto LAB_0014d5b0;
    if (*(char *)(lVar43 + 4 + lVar23) == '\0') goto LAB_0014d5bf;
    if ((*(char *)(lVar18 + 3 + lVar43) == '\0') ||
       (uVar12 = uVar32, *(char *)(lVar18 + uVar32) == '\0')) goto LAB_0014d593;
    goto LAB_0014d98a;
  }
  goto LAB_0014d5ce;
LAB_0014de73:
  cVar2 = *(char *)(lVar18 + -1 + uVar32);
joined_r0x0014dfc8:
  if (cVar2 != '\0') goto LAB_0014e053;
  uVar9 = *(uint *)(lVar10 + -8 + uVar32 * 4);
  uVar25 = *(uint *)(lVar10 + uVar32 * 4);
LAB_0014e0f7:
  uVar9 = UFPC::Merge(uVar9,uVar25);
  goto LAB_0014e0fc;
LAB_0014d624:
  uVar31 = (ulong)UFPC::length_;
  UFPC::P_[uVar31] = UFPC::length_;
  UFPC::length_ = UFPC::length_ + 1;
  goto LAB_0014d547;
LAB_0014d593:
  uVar9 = UFPC::Merge(*(uint *)(lVar10 + 0x10 + lVar43 * 4),*(uint *)(lVar28 + lVar43 * 4));
  *(uint *)(lVar28 + 8 + lVar43 * 4) = uVar9;
  goto LAB_0014d641;
code_r0x0014bbfc:
  *(undefined4 *)(lVar21 + lVar24 * 4) = *(undefined4 *)(lVar38 + lVar17 + lVar24 * 4);
  lVar16 = lVar16 + 0x200000000;
  lVar24 = lVar24 + 2;
  goto LAB_0014bba6;
LAB_0014b7ad:
  iVar40 = iVar40 + iVar42 + 2;
  *(undefined4 *)(lVar13 + lVar38 + 8 + lVar37 * 4) = *(undefined4 *)(lVar18 + lVar20);
LAB_0014c261:
  lVar13 = (long)iVar40;
  uVar12 = lVar13 + 2;
  if (iVar35 <= (int)uVar12) {
    uVar34 = uVar12 & 0xffffffff;
    if (iVar35 < (int)uVar12) {
      if (*(char *)(lVar36 + uVar34) == '\0') {
LAB_0014c316:
        iVar40 = (int)uVar12;
LAB_0014c31b:
        if (*(char *)(lVar26 + uVar34) == '\0') {
          *(undefined4 *)(lVar18 + uVar34 * 4) = 0;
        }
        else {
LAB_0014c32c:
          lVar36 = (long)iVar40;
          if (*(char *)(lVar26 + -1 + lVar36) == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar8 = UFPC::length_ + 1;
            *(uint *)(lVar18 + lVar36 * 4) = UFPC::length_;
            UFPC::length_ = uVar8;
          }
          else {
            *(undefined4 *)(lVar18 + lVar36 * 4) = *(undefined4 *)(lVar18 + -8 + lVar36 * 4);
          }
        }
        goto LAB_0014c149;
      }
      if (*(char *)(lVar26 + 1 + lVar13) == '\0') {
LAB_0014c304:
        uVar31 = uVar12 & 0xffffffff;
        goto LAB_0014a688;
      }
    }
    else {
      if (*(char *)(lVar36 + uVar34) == '\0') {
        if (*(char *)(lVar26 + uVar34) == '\0') {
LAB_0014c597:
          uVar31 = uVar12 & 0xffffffff;
          goto LAB_0014a981;
        }
        if (*(char *)(lVar36 + 3 + lVar13) == '\0') {
LAB_0014c58a:
          iVar40 = (int)uVar12;
          goto LAB_0014c32c;
        }
      }
      if (*(char *)(lVar26 + 1 + lVar13) == '\0') {
LAB_0014c3db:
        uVar8 = (uint)uVar12;
        goto LAB_0014a5fc;
      }
      if (*(char *)(lVar33 + 3 + lVar13) != '\0') {
        if (*(char *)(lVar33 + lVar13) == '\0') goto LAB_0014c39c;
LAB_0014c37a:
        lVar36 = (long)(int)uVar12;
        if (*(char *)(lVar23 + -1 + lVar36) != '\0') goto LAB_0014cccf;
        uVar8 = UFPC::Merge(*(uint *)(lVar11 + lVar36 * 4),*(uint *)(lVar18 + -8 + lVar36 * 4));
        *(uint *)(lVar18 + lVar36 * 4) = uVar8;
        goto LAB_0014c149;
      }
    }
    if (*(char *)(lVar33 + uVar34) != '\0') goto LAB_0014c4e0;
    goto LAB_0014c50a;
  }
  if (*(char *)(lVar36 + uVar12) == '\0') {
    if (*(char *)(lVar26 + uVar12) == '\0') goto LAB_0014c65e;
    if (*(char *)(lVar13 + 3 + lVar36) == '\0') goto LAB_0014c54d;
    if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_0014a760;
    if (*(char *)(lVar33 + 3 + lVar13) != '\0') {
      if (*(char *)(lVar33 + lVar13) == '\0') goto LAB_0014b47a;
      goto LAB_0014c437;
    }
  }
  else {
    if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_0014a658;
    if (*(char *)(lVar13 + 3 + lVar33) != '\0') {
      if (*(char *)(lVar33 + lVar13) == '\0') {
LAB_0014b402:
        uVar8 = UFPC::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
        *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
      }
      else {
LAB_0014c2a8:
        if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
          uVar8 = UFPC::Merge(*(uint *)(lVar11 + uVar12 * 4),*(uint *)(lVar18 + -8 + uVar12 * 4));
          *(uint *)(lVar18 + uVar12 * 4) = uVar8;
        }
        else {
LAB_0014c1cf:
          lVar13 = (long)(int)uVar12;
          if (*(char *)(lVar33 + lVar13) == '\0') {
            uVar8 = *(uint *)(lVar11 + lVar13 * 4);
            if (*(char *)(lVar23 + lVar13) == '\0') {
              uVar8 = UFPC::Merge(uVar8,*(uint *)(lVar18 + -8 + lVar13 * 4));
              *(uint *)(lVar18 + lVar13 * 4) = uVar8;
            }
            else {
              *(uint *)(lVar18 + lVar13 * 4) = uVar8;
            }
          }
          else {
            *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
          }
        }
      }
      goto LAB_0014c971;
    }
    if (*(char *)(lVar36 + 3 + lVar13) == '\0') {
      if (*(char *)(lVar33 + uVar12) == '\0') goto LAB_0014c733;
      if (*(char *)(lVar33 + lVar13) != '\0') goto LAB_0014c710;
      uVar8 = UFPC::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
      *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
      goto LAB_0014b26b;
    }
  }
  if (*(char *)(lVar13 + 4 + lVar33) == '\0') {
    if (*(char *)(lVar33 + 2 + lVar13) != '\0') {
      if (*(char *)(lVar33 + lVar13) == '\0') {
        uVar8 = UFPC::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
        *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
        uVar32 = uVar12 & 0xffffffff;
      }
      else {
LAB_0014c750:
        uVar32 = uVar12 & 0xffffffff;
        uVar8 = *(uint *)(lVar11 + uVar12 * 4);
        if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
          uVar8 = UFPC::Merge(uVar8,*(uint *)(lVar18 + -8 + uVar12 * 4));
          *(uint *)(lVar18 + uVar12 * 4) = uVar8;
        }
        else {
          *(uint *)(lVar18 + uVar12 * 4) = uVar8;
        }
      }
      goto LAB_0014b926;
    }
LAB_0014c776:
    *(undefined4 *)(lVar18 + 8 + lVar13 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
LAB_0014b58d:
    uVar32 = uVar12 & 0xffffffff;
LAB_0014b3de:
    lVar13 = (long)(int)uVar32;
    uVar12 = lVar13 + 2;
    if (iVar35 <= (int)uVar12) {
      if (iVar35 < (int)uVar12) goto LAB_0014b964;
      uVar34 = uVar12 & 0xffffffff;
      if (*(char *)(lVar36 + uVar34) == '\0') {
        if (*(char *)(lVar26 + uVar34) == '\0') goto LAB_0014c0d5;
        if (*(char *)(lVar36 + 3 + lVar13) == '\0') goto LAB_0014c50a;
      }
      if (*(char *)(lVar33 + 3 + lVar13) == '\0') goto LAB_0014c50a;
      goto LAB_0014c39c;
    }
    if (*(char *)(lVar36 + uVar12) != '\0') {
      if (*(char *)(lVar13 + 3 + lVar33) != '\0') goto LAB_0014b402;
      if (*(char *)(lVar36 + 3 + lVar13) == '\0') goto LAB_0014ba5a;
LAB_0014b4bc:
      if (*(char *)(lVar13 + 4 + lVar33) == '\0') goto LAB_0014ba69;
      uVar8 = UFPC::Merge(*(uint *)(lVar11 + 0x10 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
      *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
      uVar32 = uVar12 & 0xffffffff;
      goto LAB_0014b59f;
    }
    if (*(char *)(lVar26 + uVar12) == '\0') {
LAB_0014b522:
      iVar40 = (int)uVar12;
      lVar13 = (long)iVar40;
      if (*(char *)(lVar13 + 1 + lVar36) == '\0') goto LAB_0014a846;
      if (*(char *)(lVar33 + 1 + lVar13) == '\0') goto LAB_0014b550;
      *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
    }
    else {
      if (*(char *)(lVar13 + 3 + lVar36) == '\0') goto LAB_0014ba41;
      if (*(char *)(lVar33 + 3 + lVar13) == '\0') goto LAB_0014b4bc;
LAB_0014b47a:
      uVar8 = UFPC::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
      *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
    }
LAB_0014c10f:
    lVar13 = (long)(int)uVar12;
    uVar31 = lVar13 + 2;
    uVar8 = (uint)uVar31;
    uVar32 = uVar31;
    if (iVar35 <= (int)uVar8) {
      if (iVar35 < (int)uVar8) goto LAB_0014c132;
      uVar12 = uVar31 & 0xffffffff;
      if (*(char *)(lVar36 + uVar12) != '\0') goto LAB_0014ccc4;
      if (*(char *)(lVar26 + uVar12) == '\0') goto LAB_0014a97e;
      if (*(char *)(lVar36 + 3 + lVar13) != '\0') goto LAB_0014ccc4;
      uVar15 = *(undefined4 *)(lVar18 + lVar13 * 4);
      goto LAB_0014d1a8;
    }
    if (*(char *)(lVar36 + uVar31) == '\0') {
      if (*(char *)(lVar26 + uVar31) == '\0') goto LAB_0014a74f;
      if (*(char *)(lVar36 + 3 + lVar13) == '\0') {
        *(undefined4 *)(lVar18 + 8 + lVar13 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
LAB_0014add7:
        lVar13 = (long)(int)uVar32;
        uVar32 = lVar13 + 2;
        iVar40 = (int)uVar32;
        if (iVar40 < iVar35) {
          uVar31 = uVar32;
          if (*(char *)(lVar36 + uVar32) == '\0') goto LAB_0014ac01;
          if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_0014aa12;
LAB_0014ae04:
          iVar40 = (int)uVar32;
          uVar12 = (ulong)iVar40;
          if (*(char *)(uVar12 + 1 + lVar33) != '\0') {
            if ((*(char *)(lVar33 + uVar12) != '\0') || (*(char *)(lVar33 + -1 + uVar12) == '\0')) {
              uVar8 = UFPC::Merge(*(uint *)(lVar11 + uVar12 * 4),*(uint *)(lVar18 + -8 + uVar12 * 4)
                                 );
              *(uint *)(lVar18 + uVar12 * 4) = uVar8;
LAB_0014ae46:
              uVar12 = uVar32 & 0xffffffff;
              goto LAB_0014c971;
            }
            if (*(char *)(lVar23 + uVar12) == '\0') {
              uVar8 = UFPC::Merge(*(uint *)(lVar11 + -8 + uVar12 * 4),*(uint *)(lVar11 + uVar12 * 4)
                                 );
              uVar7 = *(uint *)(lVar18 + -8 + uVar12 * 4);
            }
            else {
              uVar8 = *(uint *)(lVar11 + uVar12 * 4);
              uVar7 = *(uint *)(lVar18 + -8 + uVar12 * 4);
            }
            uVar8 = UFPC::Merge(uVar8,uVar7);
            *(uint *)(lVar18 + uVar12 * 4) = uVar8;
            goto LAB_0014bfd5;
          }
          if (*(char *)(lVar36 + 1 + uVar12) != '\0') {
            if (*(char *)(uVar12 + 2 + lVar33) != '\0') {
              if (*(char *)(lVar33 + uVar12) != '\0') {
                cVar2 = *(char *)(lVar23 + 1 + uVar12);
                goto joined_r0x0014af35;
              }
              if (*(char *)(lVar33 + -1 + uVar12) == '\0') {
                uVar8 = *(uint *)(lVar11 + 8 + uVar12 * 4);
                uVar7 = *(uint *)(lVar18 + -8 + uVar12 * 4);
              }
              else {
                if (*(char *)(lVar23 + 1 + uVar12) != '\0') {
                  if (*(char *)(lVar23 + uVar12) != '\0') goto LAB_0014c81d;
                  uVar8 = *(uint *)(lVar11 + -8 + uVar12 * 4);
                  goto LAB_0014c837;
                }
                uVar8 = UFPC::Merge(*(uint *)(lVar11 + -8 + uVar12 * 4),
                                    *(uint *)(lVar11 + 8 + uVar12 * 4));
                uVar7 = *(uint *)(lVar18 + -8 + uVar12 * 4);
              }
              uVar8 = UFPC::Merge(uVar8,uVar7);
              *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              goto LAB_0014b59f;
            }
            if (*(char *)(lVar33 + -1 + uVar12) != '\0') {
              uVar8 = UFPC::Merge(*(uint *)(lVar11 + -8 + uVar12 * 4),
                                  *(uint *)(lVar18 + -8 + uVar12 * 4));
              *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              goto LAB_0014bb42;
            }
LAB_0014aceb:
            if (*(char *)(lVar33 + uVar12) == '\0') {
              *(undefined4 *)(lVar18 + uVar12 * 4) = *(undefined4 *)(lVar18 + -8 + uVar12 * 4);
              goto LAB_0014b3de;
            }
            uVar8 = UFPC::Merge(*(uint *)(lVar11 + uVar12 * 4),*(uint *)(lVar18 + -8 + uVar12 * 4));
            *(uint *)(lVar18 + uVar12 * 4) = uVar8;
            goto LAB_0014b926;
          }
          uVar31 = (ulong)iVar40;
          if (*(char *)(lVar33 + -1 + uVar31) != '\0') {
            uVar8 = UFPC::Merge(*(uint *)(lVar11 + -8 + uVar31 * 4),
                                *(uint *)(lVar18 + -8 + uVar31 * 4));
            goto LAB_0014c259;
          }
LAB_0014b181:
          uVar12 = uVar32 & 0xffffffff;
          if (*(char *)(lVar33 + uVar31) != '\0') {
            uVar8 = UFPC::Merge(*(uint *)(lVar11 + uVar31 * 4),*(uint *)(lVar18 + -8 + uVar31 * 4));
            *(uint *)(lVar18 + uVar31 * 4) = uVar8;
            goto LAB_0014b26b;
          }
          *(undefined4 *)(lVar18 + uVar31 * 4) = *(undefined4 *)(lVar18 + -8 + uVar31 * 4);
LAB_0014ab26:
          lVar13 = (long)(int)uVar12;
          uVar31 = lVar13 + 2;
          iVar40 = (int)uVar31;
          if (iVar35 <= iVar40) {
            uVar34 = uVar31 & 0xffffffff;
            if (iVar40 <= iVar35) {
              if (*(char *)(lVar36 + uVar34) == '\0') goto LAB_0014afd8;
              uVar34 = (ulong)iVar40;
              goto LAB_0014aff9;
            }
            if (*(char *)(lVar36 + uVar34) == '\0') {
              uVar12 = uVar31 & 0xffffffff;
              goto LAB_0014c316;
            }
            if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_0014a688;
            uVar34 = (ulong)iVar40;
            goto LAB_0014b014;
          }
          if (*(char *)(lVar36 + uVar31) != '\0') goto code_r0x0014ab42;
LAB_0014ac01:
          uVar32 = uVar31 & 0xffffffff;
          uVar31 = (ulong)(int)uVar31;
          if (*(char *)(lVar26 + uVar31) != '\0') {
            if (*(char *)(lVar36 + 1 + uVar31) == '\0') goto LAB_0014ad9f;
            uVar12 = uVar32;
            if (*(char *)(lVar26 + -1 + uVar31) == '\0') goto LAB_0014a760;
LAB_0014ac21:
            if (*(char *)(lVar33 + 1 + uVar31) == '\0') goto LAB_0014ac85;
            uVar8 = UFPC::Merge(*(uint *)(lVar11 + uVar31 * 4),*(uint *)(lVar18 + -8 + uVar31 * 4));
            *(uint *)(lVar18 + uVar31 * 4) = uVar8;
            uVar12 = uVar32;
            goto LAB_0014c10f;
          }
LAB_0014a74f:
          while( true ) {
            while( true ) {
              while( true ) {
                iVar40 = (int)uVar32;
                uVar12 = uVar32 & 0xffffffff;
                if (*(char *)(lVar36 + 1 + (long)iVar40) != '\0') goto LAB_0014a760;
LAB_0014a846:
                uVar8 = UFPC::length_;
                lVar13 = (long)iVar40;
                if (*(char *)(lVar26 + 1 + lVar13) == '\0') break;
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar7 = UFPC::length_ + 1;
                *(uint *)(lVar18 + lVar13 * 4) = UFPC::length_;
                UFPC::length_ = uVar7;
                uVar31 = lVar13 + 2;
                iVar40 = (int)uVar31;
                if (iVar35 <= iVar40) {
                  uVar32 = uVar31 & 0xffffffff;
                  if (iVar35 < iVar40) {
                    if (*(char *)(lVar36 + uVar32) == '\0') {
                      uVar12 = (ulong)iVar40;
                      goto LAB_0014c13c;
                    }
                    uVar32 = uVar31 & 0xffffffff;
                    goto LAB_0014aece;
                  }
                  if (*(char *)(lVar36 + uVar32) != '\0') {
                    uVar32 = uVar31 & 0xffffffff;
                    goto LAB_0014ae89;
                  }
                  if (*(char *)(lVar26 + uVar32) == '\0') goto LAB_0014a981;
                  if (*(char *)(lVar36 + 3 + lVar13) == '\0') goto LAB_0014d194;
                  uVar34 = (ulong)iVar40;
                  goto LAB_0014b00c;
                }
                if (*(char *)(lVar36 + uVar31) != '\0') {
                  uVar32 = uVar31 & 0xffffffff;
                  goto LAB_0014ae04;
                }
                if (*(char *)(lVar26 + uVar31) != '\0') {
                  if (*(char *)(lVar36 + 3 + lVar13) != '\0') {
                    uVar32 = uVar31 & 0xffffffff;
                    goto LAB_0014ac21;
                  }
                  *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
                  uVar32 = uVar31 & 0xffffffff;
                  goto LAB_0014add7;
                }
                uVar32 = uVar31 & 0xffffffff;
              }
              *(undefined4 *)(lVar18 + lVar13 * 4) = 0;
              uVar32 = lVar13 + 2;
              if (iVar35 <= (int)uVar32) {
                cVar2 = *(char *)(lVar36 + (uVar32 & 0xffffffff));
                if ((int)uVar32 <= iVar35) {
                  if (cVar2 != '\0') goto LAB_0014af40;
                  goto LAB_0014a962;
                }
                if (cVar2 != '\0') goto LAB_0014afa5;
                goto LAB_0014a90b;
              }
              if (*(char *)(lVar36 + uVar32) != '\0') break;
LAB_0014a701:
              lVar13 = (long)(int)uVar32;
              if (*(char *)(lVar26 + lVar13) != '\0') {
                if (*(char *)(lVar36 + 1 + lVar13) != '\0') {
                  uVar12 = uVar32 & 0xffffffff;
                  goto LAB_0014a760;
                }
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar8 = UFPC::length_ + 1;
                *(uint *)(lVar18 + lVar13 * 4) = UFPC::length_;
                UFPC::length_ = uVar8;
                goto LAB_0014add7;
              }
            }
LAB_0014aa12:
            iVar40 = (int)uVar32;
            lVar13 = (long)iVar40;
            if (*(char *)(lVar13 + 1 + lVar33) != '\0') {
              if ((*(char *)(lVar33 + lVar13) != '\0') || (*(char *)(lVar33 + -1 + lVar13) == '\0'))
              {
                *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
                goto LAB_0014ae46;
              }
              uVar12 = uVar32 & 0xffffffff;
              goto LAB_0014cc41;
            }
            if (*(char *)(lVar36 + 1 + lVar13) != '\0') break;
            lVar13 = (long)iVar40;
            if (*(char *)(lVar33 + lVar13) == '\0') goto LAB_0014aaaa;
            *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
            uVar12 = uVar32 & 0xffffffff;
LAB_0014b26b:
            while( true ) {
              lVar13 = (long)(int)uVar12;
              uVar12 = lVar13 + 2;
              if (iVar35 <= (int)uVar12) {
                uVar34 = uVar12 & 0xffffffff;
                if (iVar35 < (int)uVar12) {
                  if (*(char *)(lVar36 + uVar34) == '\0') goto LAB_0014c316;
                  if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_0014c304;
                }
                else {
                  if (*(char *)(lVar36 + uVar34) == '\0') {
                    if (*(char *)(lVar26 + uVar34) == '\0') goto LAB_0014c597;
                    if (*(char *)(lVar36 + 3 + lVar13) == '\0') goto LAB_0014c58a;
                  }
                  if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_0014c3db;
                  if (*(char *)(lVar33 + 3 + lVar13) != '\0') goto LAB_0014c37a;
                }
                if (*(char *)(lVar33 + uVar34) == '\0') goto LAB_0014c50a;
                goto LAB_0014c4ee;
              }
              if (*(char *)(lVar36 + uVar12) == '\0') break;
              if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_0014a658;
              if (*(char *)(lVar13 + 3 + lVar33) != '\0') goto LAB_0014c2a8;
              if (*(char *)(lVar36 + 3 + lVar13) != '\0') goto LAB_0014b35e;
              if (*(char *)(lVar33 + uVar12) == '\0') goto LAB_0014c733;
LAB_0014c710:
              uVar8 = *(uint *)(lVar11 + uVar12 * 4);
              if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
                uVar8 = UFPC::Merge(uVar8,*(uint *)(lVar18 + -8 + uVar12 * 4));
                *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              }
              else {
                *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              }
            }
            if (*(char *)(lVar26 + uVar12) != '\0') {
              if (*(char *)(lVar13 + 3 + lVar36) == '\0') goto LAB_0014c54d;
              if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_0014a760;
              if (*(char *)(lVar33 + 3 + lVar13) != '\0') goto LAB_0014c437;
LAB_0014b35e:
              if (*(char *)(lVar13 + 4 + lVar33) == '\0') {
                if (*(char *)(lVar33 + uVar12) != '\0') goto LAB_0014c750;
                goto LAB_0014c776;
              }
              if (*(char *)(lVar23 + 3 + lVar13) != '\0') goto LAB_0014c603;
              if (*(char *)(lVar33 + uVar12) != '\0') goto LAB_0014c810;
              goto LAB_0014c782;
            }
LAB_0014c65e:
            uVar32 = uVar12 & 0xffffffff;
          }
          uVar31 = (ulong)iVar40;
          if (*(char *)(lVar33 + 2 + uVar31) == '\0') {
            if (*(char *)(lVar33 + uVar31) != '\0') {
              *(undefined4 *)(lVar18 + uVar31 * 4) = *(undefined4 *)(lVar11 + uVar31 * 4);
              goto LAB_0014b926;
            }
            if (*(char *)(lVar33 + -1 + uVar31) == '\0') {
              UFPC::P_[UFPC::length_] = UFPC::length_;
              uVar8 = UFPC::length_ + 1;
              *(uint *)(lVar18 + uVar31 * 4) = UFPC::length_;
              UFPC::length_ = uVar8;
            }
            else {
              *(undefined4 *)(lVar18 + uVar31 * 4) = *(undefined4 *)(lVar11 + -8 + uVar31 * 4);
            }
            goto LAB_0014b3de;
          }
          if (*(char *)(lVar33 + uVar31) != '\0') goto LAB_0014a79d;
          if (*(char *)(lVar33 + -1 + uVar31) == '\0') goto LAB_0014c228;
LAB_0014cf0f:
          if ((*(char *)(lVar23 + 1 + uVar31) == '\0') || (*(char *)(lVar23 + uVar31) == '\0')) {
            uVar8 = UFPC::Merge(*(uint *)(lVar11 + -8 + uVar31 * 4),
                                *(uint *)(lVar11 + 8 + uVar31 * 4));
          }
          else {
            uVar8 = *(uint *)(lVar11 + 8 + uVar31 * 4);
          }
          *(uint *)(lVar18 + uVar31 * 4) = uVar8;
          goto LAB_0014b59f;
        }
        uVar34 = uVar32 & 0xffffffff;
        if (iVar35 < iVar40) {
          if (*(char *)(lVar36 + uVar34) == '\0') goto LAB_0014c31b;
          if (*(char *)(lVar26 + 1 + lVar13) == '\0') {
LAB_0014afa5:
            uVar12 = (ulong)(int)uVar32;
            if (*(char *)(lVar33 + uVar12) != '\0') goto LAB_0014a696;
            if (*(char *)(lVar33 + -1 + uVar12) == '\0') goto LAB_0014a9a5;
            uVar15 = *(undefined4 *)(lVar11 + -8 + uVar12 * 4);
            goto LAB_0014c146;
          }
LAB_0014aece:
          uVar34 = (ulong)(int)uVar32;
          if (*(char *)(lVar33 + -1 + uVar34) == '\0') {
LAB_0014b014:
            if (*(char *)(lVar33 + uVar34) != '\0') goto LAB_0014b01b;
            uVar15 = *(undefined4 *)(lVar18 + -8 + uVar34 * 4);
            goto LAB_0014bf9e;
          }
          uVar8 = *(uint *)(lVar11 + -8 + uVar34 * 4);
        }
        else {
          if (*(char *)(lVar36 + uVar34) == '\0') {
            uVar31 = uVar32 & 0xffffffff;
LAB_0014afd8:
            iVar40 = (int)uVar31;
            if (*(char *)(lVar26 + uVar34) == '\0') goto LAB_0014a981;
            uVar34 = (ulong)iVar40;
            if (*(char *)(lVar36 + 1 + uVar34) == '\0') goto LAB_0014c32c;
LAB_0014aff9:
            uVar8 = (uint)uVar31;
            if (*(char *)(lVar26 + -1 + uVar34) == '\0') goto LAB_0014a5fc;
LAB_0014b00c:
            if (*(char *)(lVar33 + 1 + uVar34) == '\0') goto LAB_0014b014;
          }
          else {
            if (*(char *)(lVar26 + 1 + lVar13) == '\0') {
LAB_0014af40:
              lVar36 = (long)(int)uVar32;
              if (*(char *)(lVar33 + 1 + lVar36) == '\0') goto LAB_0014afa5;
              if ((*(char *)(lVar33 + lVar36) != '\0') || (*(char *)(lVar33 + -1 + lVar36) == '\0'))
              goto LAB_0014ccd6;
              goto LAB_0014af62;
            }
LAB_0014ae89:
            uVar34 = (ulong)(int)uVar32;
            if (*(char *)(lVar33 + 1 + uVar34) == '\0') goto LAB_0014aece;
            if ((*(char *)(lVar33 + uVar34) == '\0') && (*(char *)(lVar33 + -1 + uVar34) != '\0')) {
              if (*(char *)(lVar23 + uVar34) == '\0') {
                uVar8 = UFPC::Merge(*(uint *)(lVar11 + -8 + uVar34 * 4),
                                    *(uint *)(lVar11 + uVar34 * 4));
                uVar7 = *(uint *)(lVar18 + -8 + uVar34 * 4);
              }
              else {
                uVar8 = *(uint *)(lVar11 + uVar34 * 4);
                uVar7 = *(uint *)(lVar18 + -8 + uVar34 * 4);
              }
              uVar8 = UFPC::Merge(uVar8,uVar7);
              *(uint *)(lVar18 + uVar34 * 4) = uVar8;
              goto LAB_0014c149;
            }
          }
LAB_0014b01b:
          uVar8 = *(uint *)(lVar11 + uVar34 * 4);
        }
        uVar7 = *(uint *)(lVar18 + -8 + uVar34 * 4);
        goto LAB_0014b027;
      }
      uVar12 = uVar31 & 0xffffffff;
LAB_0014cb77:
      uVar32 = uVar12 & 0xffffffff;
      if (*(char *)(lVar33 + 1 + uVar31) != '\0') goto LAB_0014cb8b;
      goto LAB_0014c1fe;
    }
LAB_0014c1c2:
    iVar40 = (int)uVar32;
    uVar31 = (ulong)iVar40;
    if (*(char *)(uVar31 + 1 + lVar33) != '\0') {
      uVar12 = uVar32 & 0xffffffff;
      goto LAB_0014c1cf;
    }
    if (*(char *)(lVar36 + 1 + uVar31) != '\0') goto LAB_0014c1fe;
    uVar8 = *(uint *)(lVar18 + -8 + uVar31 * 4);
LAB_0014c259:
    *(uint *)(lVar18 + uVar31 * 4) = uVar8;
    goto LAB_0014c261;
  }
  if (*(char *)(lVar23 + 3 + lVar13) == '\0') {
    if (*(char *)(lVar33 + uVar12) == '\0') {
      uVar8 = *(uint *)(lVar11 + 0x10 + lVar13 * 4);
      uVar7 = *(uint *)(lVar18 + lVar13 * 4);
    }
    else {
      if (*(char *)(lVar33 + lVar13) != '\0') {
LAB_0014c810:
        uVar32 = uVar12 & 0xffffffff;
        cVar2 = *(char *)(lVar23 + -1 + uVar12);
joined_r0x0014af35:
        if (cVar2 == '\0') {
          uVar8 = *(uint *)(lVar11 + uVar12 * 4);
LAB_0014c837:
          uVar8 = UFPC::Merge(uVar8,*(uint *)(lVar11 + 8 + uVar12 * 4));
          uVar7 = *(uint *)(lVar18 + -8 + uVar12 * 4);
        }
        else {
LAB_0014c81d:
          uVar8 = *(uint *)(lVar11 + 8 + uVar12 * 4);
          uVar7 = *(uint *)(lVar18 + -8 + uVar12 * 4);
        }
        uVar8 = UFPC::Merge(uVar8,uVar7);
        *(uint *)(lVar18 + uVar12 * 4) = uVar8;
        goto LAB_0014b59f;
      }
      uVar8 = UFPC::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),*(uint *)(lVar11 + 0x10 + lVar13 * 4));
      uVar7 = *(uint *)(lVar18 + lVar13 * 4);
    }
    uVar8 = UFPC::Merge(uVar8,uVar7);
    *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
    uVar32 = uVar12 & 0xffffffff;
    goto LAB_0014b59f;
  }
  if (*(char *)(lVar33 + lVar13) == '\0') {
LAB_0014c782:
    uVar8 = UFPC::Merge(*(uint *)(lVar11 + 0x10 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
    *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
LAB_0014b563:
    uVar32 = uVar12 & 0xffffffff;
    goto LAB_0014b59f;
  }
LAB_0014c603:
  uVar32 = uVar12 & 0xffffffff;
  cVar2 = *(char *)(lVar23 + -1 + uVar12);
  uVar31 = uVar12;
joined_r0x0014c218:
  if (cVar2 == '\0') {
    uVar8 = UFPC::Merge(*(uint *)(lVar11 + 8 + uVar31 * 4),*(uint *)(lVar18 + -8 + uVar31 * 4));
  }
  else {
    if (*(char *)(lVar33 + uVar31) == '\0') {
      uVar8 = *(uint *)(lVar11 + 8 + uVar31 * 4);
      if (*(char *)(lVar23 + uVar31) == '\0') {
        uVar8 = UFPC::Merge(uVar8,*(uint *)(lVar18 + -8 + uVar31 * 4));
        *(uint *)(lVar18 + uVar31 * 4) = uVar8;
      }
      else {
        *(uint *)(lVar18 + uVar31 * 4) = uVar8;
      }
      goto LAB_0014b59f;
    }
LAB_0014c228:
    uVar8 = *(uint *)(lVar11 + 8 + uVar31 * 4);
  }
  *(uint *)(lVar18 + uVar31 * 4) = uVar8;
  goto LAB_0014b59f;
LAB_0014ba5a:
  *(undefined4 *)(lVar18 + 8 + lVar13 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
  iVar40 = (int)uVar12;
  goto LAB_0014c261;
LAB_0014b550:
  if (*(char *)(lVar13 + 2 + lVar33) != '\0') {
    *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + 8 + lVar13 * 4);
    goto LAB_0014b563;
  }
  UFPC::P_[UFPC::length_] = UFPC::length_;
  uVar8 = UFPC::length_ + 1;
  *(uint *)(lVar18 + lVar13 * 4) = UFPC::length_;
  UFPC::length_ = uVar8;
  goto LAB_0014b58d;
code_r0x0014ab42:
  if (*(char *)(lVar26 + 1 + lVar13) == '\0') {
    uVar12 = uVar31 & 0xffffffff;
    goto LAB_0014a658;
  }
  if (*(char *)(lVar13 + 3 + lVar33) != '\0') {
    uVar8 = UFPC::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
    *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
    uVar12 = uVar31 & 0xffffffff;
    goto LAB_0014c971;
  }
  uVar32 = uVar31;
  if (*(char *)(lVar36 + 3 + lVar13) != '\0') {
LAB_0014ac85:
    uVar12 = (ulong)(int)uVar32;
    if (*(char *)(uVar12 + 2 + lVar33) == '\0') {
      uVar32 = uVar32 & 0xffffffff;
      goto LAB_0014aceb;
    }
    if (*(char *)(lVar23 + 1 + uVar12) == '\0') {
      if (*(char *)(lVar33 + uVar12) == '\0') {
        uVar7 = *(uint *)(lVar11 + 8 + uVar12 * 4);
        uVar8 = *(uint *)(lVar18 + -8 + uVar12 * 4);
      }
      else {
        uVar7 = UFPC::Merge(*(uint *)(lVar11 + uVar12 * 4),*(uint *)(lVar11 + 8 + uVar12 * 4));
        uVar8 = *(uint *)(lVar18 + -8 + uVar12 * 4);
      }
      uVar8 = UFPC::Merge(uVar7,uVar8);
      *(uint *)(lVar18 + uVar12 * 4) = uVar8;
      uVar32 = uVar32 & 0xffffffff;
    }
    else {
      uVar8 = UFPC::Merge(*(uint *)(lVar11 + 8 + uVar12 * 4),*(uint *)(lVar18 + -8 + uVar12 * 4));
      *(uint *)(lVar18 + uVar12 * 4) = uVar8;
      uVar32 = uVar32 & 0xffffffff;
    }
    goto LAB_0014b59f;
  }
  goto LAB_0014b181;
LAB_0014aaaa:
  if (*(char *)(lVar33 + -1 + lVar13) == '\0') {
    UFPC::P_[UFPC::length_] = UFPC::length_;
    uVar8 = UFPC::length_ + 1;
    *(uint *)(lVar18 + lVar13 * 4) = UFPC::length_;
    UFPC::length_ = uVar8;
  }
  else {
    *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + -8 + lVar13 * 4);
  }
  uVar12 = uVar32 & 0xffffffff;
  goto LAB_0014ab26;
LAB_0014c54d:
  uVar32 = uVar12 & 0xffffffff;
LAB_0014ad9f:
  lVar13 = (long)(int)uVar32;
  if (*(char *)(lVar26 + -1 + lVar13) == '\0') {
    UFPC::P_[UFPC::length_] = UFPC::length_;
    uVar8 = UFPC::length_ + 1;
    *(uint *)(lVar18 + lVar13 * 4) = UFPC::length_;
    UFPC::length_ = uVar8;
  }
  else {
    *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar18 + -8 + lVar13 * 4);
  }
  goto LAB_0014add7;
LAB_0014c437:
  if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
    uVar8 = UFPC::Merge(*(uint *)(lVar11 + uVar12 * 4),*(uint *)(lVar18 + -8 + uVar12 * 4));
    *(uint *)(lVar18 + uVar12 * 4) = uVar8;
  }
  else {
LAB_0014cb8b:
    lVar13 = (long)(int)uVar12;
    if (*(char *)(lVar33 + lVar13) == '\0') {
      uVar8 = *(uint *)(lVar11 + lVar13 * 4);
      if (*(char *)(lVar23 + lVar13) == '\0') {
        uVar8 = UFPC::Merge(uVar8,*(uint *)(lVar18 + -8 + lVar13 * 4));
        *(uint *)(lVar18 + lVar13 * 4) = uVar8;
      }
      else {
        *(uint *)(lVar18 + lVar13 * 4) = uVar8;
      }
    }
    else {
      *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
    }
  }
  goto LAB_0014c10f;
LAB_0014c733:
  *(undefined4 *)(lVar18 + 8 + lVar13 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
  goto LAB_0014ab26;
LAB_0014a760:
  lVar13 = (long)(int)uVar12;
  if (*(char *)(lVar33 + 1 + lVar13) != '\0') {
    *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
    goto LAB_0014c10f;
  }
LAB_0014a78c:
  uVar32 = uVar12 & 0xffffffff;
  lVar13 = (long)(int)uVar12;
  if (*(char *)(lVar33 + 2 + lVar13) != '\0') {
    if (*(char *)(lVar33 + lVar13) != '\0') goto LAB_0014a79d;
    *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + 8 + lVar13 * 4);
    goto LAB_0014b59f;
  }
  if (*(char *)(lVar33 + lVar13) != '\0') {
    *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
    goto LAB_0014b926;
  }
  UFPC::P_[UFPC::length_] = UFPC::length_;
  uVar8 = UFPC::length_ + 1;
  *(uint *)(lVar18 + lVar13 * 4) = UFPC::length_;
  UFPC::length_ = uVar8;
  goto LAB_0014b3de;
LAB_0014a79d:
  lVar13 = (long)(int)uVar32;
  if (*(char *)(lVar23 + 1 + lVar13) == '\0') {
    uVar8 = UFPC::Merge(*(uint *)(lVar11 + lVar13 * 4),*(uint *)(lVar11 + 8 + lVar13 * 4));
  }
  else {
    uVar8 = *(uint *)(lVar11 + 8 + lVar13 * 4);
  }
  *(uint *)(lVar18 + lVar13 * 4) = uVar8;
  goto LAB_0014b59f;
LAB_0014c1fe:
  if (*(char *)(lVar33 + 2 + uVar31) != '\0') {
LAB_0014c20e:
    cVar2 = *(char *)(lVar23 + 1 + uVar31);
    goto joined_r0x0014c218;
  }
  *(undefined4 *)(lVar18 + uVar31 * 4) = *(undefined4 *)(lVar18 + -8 + uVar31 * 4);
  goto LAB_0014bb42;
code_r0x0014ca32:
  *(undefined4 *)(lVar16 + lVar14 * 4) = *(undefined4 *)(lVar39 + lVar14 * 4);
  lVar24 = lVar24 + 0x200000000;
  lVar14 = lVar14 + 2;
  goto LAB_0014c9ec;
LAB_0014ccc4:
  lVar36 = (long)(int)uVar31;
  if (*(char *)(lVar33 + 1 + lVar36) == '\0') {
    uVar15 = *(undefined4 *)(lVar18 + -8 + lVar36 * 4);
  }
  else {
LAB_0014cccf:
    if (*(char *)(lVar33 + lVar36) == '\0') {
      uVar8 = *(uint *)(lVar11 + lVar36 * 4);
      if (*(char *)(lVar23 + lVar36) == '\0') {
        uVar8 = UFPC::Merge(uVar8,*(uint *)(lVar18 + -8 + lVar36 * 4));
        *(uint *)(lVar18 + lVar36 * 4) = uVar8;
      }
      else {
        *(uint *)(lVar18 + lVar36 * 4) = uVar8;
      }
      goto LAB_0014c149;
    }
LAB_0014ccd6:
    uVar15 = *(undefined4 *)(lVar11 + lVar36 * 4);
  }
  *(undefined4 *)(lVar18 + lVar36 * 4) = uVar15;
  goto LAB_0014c149;
LAB_0014a0f5:
  uVar15 = *(undefined4 *)(lVar4 + uVar12 * 4);
  uVar32 = uVar31 & 0xffffffff;
LAB_0014a0fb:
  *(undefined4 *)(lVar4 + uVar31 * 4) = uVar15;
  goto LAB_0014a078;
}

Assistant:

void FirstScan()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		e_rows = h & 0xfffffffe;
		o_rows = h % 2 == 1;
		e_cols = w & 0xfffffffe;
		o_cols = w % 2 == 1;

		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}
	}